

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx512::CurveNvIntersectorK<8,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  float fVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  long lVar58;
  undefined1 auVar59 [12];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  byte bVar71;
  byte bVar72;
  byte bVar73;
  ulong uVar74;
  byte bVar75;
  ulong uVar76;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  byte bVar77;
  byte bVar78;
  byte bVar79;
  uint uVar80;
  ulong uVar81;
  int iVar82;
  long lVar83;
  bool bVar84;
  bool bVar85;
  ulong uVar86;
  uint uVar87;
  uint uVar147;
  uint uVar148;
  uint uVar150;
  uint uVar151;
  uint uVar152;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  uint uVar149;
  uint uVar153;
  undefined1 auVar138 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar139 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float pp;
  float fVar154;
  undefined4 uVar155;
  float fVar156;
  undefined1 auVar157 [16];
  undefined1 auVar199 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar219;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar217;
  float fVar218;
  undefined1 auVar216 [64];
  float fVar220;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar241;
  float fVar242;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar244;
  undefined1 auVar243 [64];
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  float fVar250;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar251 [64];
  float fVar256;
  undefined1 auVar257 [64];
  float fVar260;
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [64];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_910;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [16];
  undefined1 local_890 [16];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  undefined1 local_770 [16];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  RTCHitN local_5a0 [32];
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  uint local_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint uStack_4b4;
  uint uStack_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte local_180 [32];
  undefined1 auStack_160 [32];
  float local_140 [2];
  int local_138 [66];
  undefined1 auVar132 [32];
  undefined1 auVar140 [32];
  undefined1 auVar143 [32];
  undefined1 auVar266 [64];
  
  PVar2 = prim[1];
  uVar74 = (ulong)(byte)PVar2;
  lVar58 = uVar74 * 0x19;
  fVar250 = *(float *)(prim + lVar58 + 0x12);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar93 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar92 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + lVar58 + 6));
  fVar220 = fVar250 * auVar92._0_4_;
  fVar154 = fVar250 * auVar93._0_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar74 * 4 + 6);
  auVar102 = vpmovsxbd_avx2(auVar12);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar74 * 5 + 6);
  auVar101 = vpmovsxbd_avx2(auVar13);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar74 * 6 + 6);
  auVar103 = vpmovsxbd_avx2(auVar90);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar199._8_8_ = 0;
  auVar199._0_8_ = *(ulong *)(prim + uVar74 * 0xb + 6);
  auVar104 = vpmovsxbd_avx2(auVar199);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar105 = vpmovsxbd_avx2(auVar88);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar74 + 6);
  auVar106 = vpmovsxbd_avx2(auVar1);
  auVar106 = vcvtdq2ps_avx(auVar106);
  uVar81 = (ulong)(uint)((int)(uVar74 * 9) * 2);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar107 = vpmovsxbd_avx2(auVar91);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar81 + uVar74 + 6);
  auVar110 = vpmovsxbd_avx2(auVar89);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar108 = vcvtdq2ps_avx(auVar110);
  uVar86 = (ulong)(uint)((int)(uVar74 * 5) << 2);
  auVar231._8_8_ = 0;
  auVar231._0_8_ = *(ulong *)(prim + uVar86 + 6);
  auVar99 = vpmovsxbd_avx2(auVar231);
  auVar109 = vcvtdq2ps_avx(auVar99);
  auVar118._4_4_ = fVar154;
  auVar118._0_4_ = fVar154;
  auVar118._8_4_ = fVar154;
  auVar118._12_4_ = fVar154;
  auVar118._16_4_ = fVar154;
  auVar118._20_4_ = fVar154;
  auVar118._24_4_ = fVar154;
  auVar118._28_4_ = fVar154;
  auVar120._8_4_ = 1;
  auVar120._0_8_ = 0x100000001;
  auVar120._12_4_ = 1;
  auVar120._16_4_ = 1;
  auVar120._20_4_ = 1;
  auVar120._24_4_ = 1;
  auVar120._28_4_ = 1;
  auVar111 = ZEXT1632(CONCAT412(fVar250 * auVar93._12_4_,
                                CONCAT48(fVar250 * auVar93._8_4_,
                                         CONCAT44(fVar250 * auVar93._4_4_,fVar154))));
  auVar100 = vpermps_avx2(auVar120,auVar111);
  auVar97 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar98 = vpermps_avx512vl(auVar97,auVar111);
  fVar154 = auVar98._0_4_;
  fVar252 = auVar98._4_4_;
  auVar111._4_4_ = fVar252 * auVar103._4_4_;
  auVar111._0_4_ = fVar154 * auVar103._0_4_;
  fVar253 = auVar98._8_4_;
  auVar111._8_4_ = fVar253 * auVar103._8_4_;
  fVar254 = auVar98._12_4_;
  auVar111._12_4_ = fVar254 * auVar103._12_4_;
  fVar245 = auVar98._16_4_;
  auVar111._16_4_ = fVar245 * auVar103._16_4_;
  fVar246 = auVar98._20_4_;
  auVar111._20_4_ = fVar246 * auVar103._20_4_;
  fVar255 = auVar98._24_4_;
  auVar111._24_4_ = fVar255 * auVar103._24_4_;
  auVar111._28_4_ = auVar110._28_4_;
  auVar110._4_4_ = auVar106._4_4_ * fVar252;
  auVar110._0_4_ = auVar106._0_4_ * fVar154;
  auVar110._8_4_ = auVar106._8_4_ * fVar253;
  auVar110._12_4_ = auVar106._12_4_ * fVar254;
  auVar110._16_4_ = auVar106._16_4_ * fVar245;
  auVar110._20_4_ = auVar106._20_4_ * fVar246;
  auVar110._24_4_ = auVar106._24_4_ * fVar255;
  auVar110._28_4_ = auVar99._28_4_;
  auVar99._4_4_ = auVar109._4_4_ * fVar252;
  auVar99._0_4_ = auVar109._0_4_ * fVar154;
  auVar99._8_4_ = auVar109._8_4_ * fVar253;
  auVar99._12_4_ = auVar109._12_4_ * fVar254;
  auVar99._16_4_ = auVar109._16_4_ * fVar245;
  auVar99._20_4_ = auVar109._20_4_ * fVar246;
  auVar99._24_4_ = auVar109._24_4_ * fVar255;
  auVar99._28_4_ = auVar98._28_4_;
  auVar12 = vfmadd231ps_fma(auVar111,auVar100,auVar101);
  auVar13 = vfmadd231ps_fma(auVar110,auVar100,auVar105);
  auVar90 = vfmadd231ps_fma(auVar99,auVar108,auVar100);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar118,auVar102);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar118,auVar104);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar107,auVar118);
  auVar119._4_4_ = fVar220;
  auVar119._0_4_ = fVar220;
  auVar119._8_4_ = fVar220;
  auVar119._12_4_ = fVar220;
  auVar119._16_4_ = fVar220;
  auVar119._20_4_ = fVar220;
  auVar119._24_4_ = fVar220;
  auVar119._28_4_ = fVar220;
  auVar99 = ZEXT1632(CONCAT412(fVar250 * auVar92._12_4_,
                               CONCAT48(fVar250 * auVar92._8_4_,
                                        CONCAT44(fVar250 * auVar92._4_4_,fVar220))));
  auVar110 = vpermps_avx2(auVar120,auVar99);
  auVar99 = vpermps_avx512vl(auVar97,auVar99);
  auVar100 = vmulps_avx512vl(auVar99,auVar103);
  auVar113._0_4_ = auVar99._0_4_ * auVar106._0_4_;
  auVar113._4_4_ = auVar99._4_4_ * auVar106._4_4_;
  auVar113._8_4_ = auVar99._8_4_ * auVar106._8_4_;
  auVar113._12_4_ = auVar99._12_4_ * auVar106._12_4_;
  auVar113._16_4_ = auVar99._16_4_ * auVar106._16_4_;
  auVar113._20_4_ = auVar99._20_4_ * auVar106._20_4_;
  auVar113._24_4_ = auVar99._24_4_ * auVar106._24_4_;
  auVar113._28_4_ = 0;
  auVar106._4_4_ = auVar99._4_4_ * auVar109._4_4_;
  auVar106._0_4_ = auVar99._0_4_ * auVar109._0_4_;
  auVar106._8_4_ = auVar99._8_4_ * auVar109._8_4_;
  auVar106._12_4_ = auVar99._12_4_ * auVar109._12_4_;
  auVar106._16_4_ = auVar99._16_4_ * auVar109._16_4_;
  auVar106._20_4_ = auVar99._20_4_ * auVar109._20_4_;
  auVar106._24_4_ = auVar99._24_4_ * auVar109._24_4_;
  auVar106._28_4_ = auVar103._28_4_;
  auVar101 = vfmadd231ps_avx512vl(auVar100,auVar110,auVar101);
  auVar199 = vfmadd231ps_fma(auVar113,auVar110,auVar105);
  auVar88 = vfmadd231ps_fma(auVar106,auVar110,auVar108);
  auVar101 = vfmadd231ps_avx512vl(auVar101,auVar119,auVar102);
  auVar199 = vfmadd231ps_fma(ZEXT1632(auVar199),auVar119,auVar104);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar119,auVar107);
  auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar268 = ZEXT3264(auVar102);
  vandps_avx512vl(ZEXT1632(auVar12),auVar102);
  auVar115._8_4_ = 0x219392ef;
  auVar115._0_8_ = 0x219392ef219392ef;
  auVar115._12_4_ = 0x219392ef;
  auVar115._16_4_ = 0x219392ef;
  auVar115._20_4_ = 0x219392ef;
  auVar115._24_4_ = 0x219392ef;
  auVar115._28_4_ = 0x219392ef;
  uVar81 = vcmpps_avx512vl(auVar102,auVar115,1);
  bVar85 = (bool)((byte)uVar81 & 1);
  auVar100._0_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar12._0_4_;
  bVar85 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar12._4_4_;
  bVar85 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar12._8_4_;
  bVar85 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar12._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar13),auVar102);
  uVar81 = vcmpps_avx512vl(auVar100,auVar115,1);
  bVar85 = (bool)((byte)uVar81 & 1);
  auVar97._0_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar13._0_4_;
  bVar85 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar13._4_4_;
  bVar85 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar13._8_4_;
  bVar85 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar13._12_4_;
  auVar97._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar97._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar97._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar97._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar90),auVar102);
  uVar81 = vcmpps_avx512vl(auVar97,auVar115,1);
  bVar85 = (bool)((byte)uVar81 & 1);
  auVar102._0_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar90._0_4_;
  bVar85 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar90._4_4_;
  bVar85 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar90._8_4_;
  bVar85 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar90._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar81 >> 7) * 0x219392ef;
  auVar103 = vrcp14ps_avx512vl(auVar100);
  auVar117._8_4_ = 0x3f800000;
  auVar117._0_8_ = &DAT_3f8000003f800000;
  auVar117._12_4_ = 0x3f800000;
  auVar117._16_4_ = 0x3f800000;
  auVar117._20_4_ = 0x3f800000;
  auVar117._24_4_ = 0x3f800000;
  auVar117._28_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar100,auVar103,auVar117);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar97);
  auVar13 = vfnmadd213ps_fma(auVar97,auVar103,auVar117);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar103,auVar103);
  auVar103 = vrcp14ps_avx512vl(auVar102);
  auVar90 = vfnmadd213ps_fma(auVar102,auVar103,auVar117);
  auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar103,auVar103);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 7 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar103 = vsubps_avx512vl(auVar102,auVar101);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 9 + 6));
  auVar107._4_4_ = auVar12._4_4_ * auVar103._4_4_;
  auVar107._0_4_ = auVar12._0_4_ * auVar103._0_4_;
  auVar107._8_4_ = auVar12._8_4_ * auVar103._8_4_;
  auVar107._12_4_ = auVar12._12_4_ * auVar103._12_4_;
  auVar107._16_4_ = auVar103._16_4_ * 0.0;
  auVar107._20_4_ = auVar103._20_4_ * 0.0;
  auVar107._24_4_ = auVar103._24_4_ * 0.0;
  auVar107._28_4_ = auVar103._28_4_;
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx512vl(auVar102,auVar101);
  auVar114._0_4_ = auVar12._0_4_ * auVar102._0_4_;
  auVar114._4_4_ = auVar12._4_4_ * auVar102._4_4_;
  auVar114._8_4_ = auVar12._8_4_ * auVar102._8_4_;
  auVar114._12_4_ = auVar12._12_4_ * auVar102._12_4_;
  auVar114._16_4_ = auVar102._16_4_ * 0.0;
  auVar114._20_4_ = auVar102._20_4_ * 0.0;
  auVar114._24_4_ = auVar102._24_4_ * 0.0;
  auVar114._28_4_ = 0;
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar2 * 0x10 + uVar74 * -2 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar199));
  auVar108._4_4_ = auVar13._4_4_ * auVar102._4_4_;
  auVar108._0_4_ = auVar13._0_4_ * auVar102._0_4_;
  auVar108._8_4_ = auVar13._8_4_ * auVar102._8_4_;
  auVar108._12_4_ = auVar13._12_4_ * auVar102._12_4_;
  auVar108._16_4_ = auVar102._16_4_ * 0.0;
  auVar108._20_4_ = auVar102._20_4_ * 0.0;
  auVar108._24_4_ = auVar102._24_4_ * 0.0;
  auVar108._28_4_ = auVar102._28_4_;
  auVar102 = vcvtdq2ps_avx(auVar101);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar199));
  auVar112._0_4_ = auVar13._0_4_ * auVar102._0_4_;
  auVar112._4_4_ = auVar13._4_4_ * auVar102._4_4_;
  auVar112._8_4_ = auVar13._8_4_ * auVar102._8_4_;
  auVar112._12_4_ = auVar13._12_4_ * auVar102._12_4_;
  auVar112._16_4_ = auVar102._16_4_ * 0.0;
  auVar112._20_4_ = auVar102._20_4_ * 0.0;
  auVar112._24_4_ = auVar102._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 + uVar74 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar88));
  auVar109._4_4_ = auVar102._4_4_ * auVar90._4_4_;
  auVar109._0_4_ = auVar102._0_4_ * auVar90._0_4_;
  auVar109._8_4_ = auVar102._8_4_ * auVar90._8_4_;
  auVar109._12_4_ = auVar102._12_4_ * auVar90._12_4_;
  auVar109._16_4_ = auVar102._16_4_ * 0.0;
  auVar109._20_4_ = auVar102._20_4_ * 0.0;
  auVar109._24_4_ = auVar102._24_4_ * 0.0;
  auVar109._28_4_ = auVar102._28_4_;
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0x17 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar88));
  auVar98._0_4_ = auVar90._0_4_ * auVar102._0_4_;
  auVar98._4_4_ = auVar90._4_4_ * auVar102._4_4_;
  auVar98._8_4_ = auVar90._8_4_ * auVar102._8_4_;
  auVar98._12_4_ = auVar90._12_4_ * auVar102._12_4_;
  auVar98._16_4_ = auVar102._16_4_ * 0.0;
  auVar98._20_4_ = auVar102._20_4_ * 0.0;
  auVar98._24_4_ = auVar102._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar102 = vpminsd_avx2(auVar107,auVar114);
  auVar101 = vpminsd_avx2(auVar108,auVar112);
  auVar102 = vmaxps_avx(auVar102,auVar101);
  auVar101 = vpminsd_avx2(auVar109,auVar98);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar103._4_4_ = uVar155;
  auVar103._0_4_ = uVar155;
  auVar103._8_4_ = uVar155;
  auVar103._12_4_ = uVar155;
  auVar103._16_4_ = uVar155;
  auVar103._20_4_ = uVar155;
  auVar103._24_4_ = uVar155;
  auVar103._28_4_ = uVar155;
  auVar101 = vmaxps_avx512vl(auVar101,auVar103);
  auVar102 = vmaxps_avx(auVar102,auVar101);
  auVar101._8_4_ = 0x3f7ffffa;
  auVar101._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar101._12_4_ = 0x3f7ffffa;
  auVar101._16_4_ = 0x3f7ffffa;
  auVar101._20_4_ = 0x3f7ffffa;
  auVar101._24_4_ = 0x3f7ffffa;
  auVar101._28_4_ = 0x3f7ffffa;
  local_420 = vmulps_avx512vl(auVar102,auVar101);
  auVar102 = vpmaxsd_avx2(auVar107,auVar114);
  auVar101 = vpmaxsd_avx2(auVar108,auVar112);
  auVar102 = vminps_avx(auVar102,auVar101);
  auVar101 = vpmaxsd_avx2(auVar109,auVar98);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar104._4_4_ = uVar155;
  auVar104._0_4_ = uVar155;
  auVar104._8_4_ = uVar155;
  auVar104._12_4_ = uVar155;
  auVar104._16_4_ = uVar155;
  auVar104._20_4_ = uVar155;
  auVar104._24_4_ = uVar155;
  auVar104._28_4_ = uVar155;
  auVar101 = vminps_avx512vl(auVar101,auVar104);
  auVar102 = vminps_avx(auVar102,auVar101);
  auVar105._8_4_ = 0x3f800003;
  auVar105._0_8_ = 0x3f8000033f800003;
  auVar105._12_4_ = 0x3f800003;
  auVar105._16_4_ = 0x3f800003;
  auVar105._20_4_ = 0x3f800003;
  auVar105._24_4_ = 0x3f800003;
  auVar105._28_4_ = 0x3f800003;
  auVar102 = vmulps_avx512vl(auVar102,auVar105);
  auVar101 = vpbroadcastd_avx512vl();
  uVar16 = vpcmpgtd_avx512vl(auVar101,_DAT_0205a920);
  uVar14 = vcmpps_avx512vl(local_420,auVar102,2);
  bVar84 = (byte)((byte)uVar14 & (byte)uVar16) == 0;
  bVar85 = !bVar84;
  if (bVar84) {
    return bVar85;
  }
  uVar81 = (ulong)(byte)((byte)uVar14 & (byte)uVar16);
  local_6a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
LAB_01d45571:
  iVar82 = 0;
  for (uVar74 = uVar81; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
    iVar82 = iVar82 + 1;
  }
  uVar81 = uVar81 - 1 & uVar81;
  uVar74 = (ulong)(uint)(iVar82 << 6);
  auVar12 = *(undefined1 (*) [16])(prim + uVar74 + lVar58 + 0x16);
  if (uVar81 != 0) {
    uVar76 = uVar81 - 1 & uVar81;
    for (uVar86 = uVar81; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
    }
    if (uVar76 != 0) {
      for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar13 = *(undefined1 (*) [16])(prim + uVar74 + lVar58 + 0x26);
  auVar90 = *(undefined1 (*) [16])(prim + uVar74 + lVar58 + 0x36);
  auVar199 = *(undefined1 (*) [16])(prim + uVar74 + lVar58 + 0x46);
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar1 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar80 = *(uint *)(prim + 2);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar96._4_4_ = uVar155;
  auVar96._0_4_ = uVar155;
  auVar96._8_4_ = uVar155;
  auVar96._12_4_ = uVar155;
  local_5c0._16_4_ = uVar155;
  local_5c0._0_16_ = auVar96;
  local_5c0._20_4_ = uVar155;
  local_5c0._24_4_ = uVar155;
  local_5c0._28_4_ = uVar155;
  auVar263 = ZEXT3264(local_5c0);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar264._4_4_ = uVar155;
  auVar264._0_4_ = uVar155;
  auVar264._8_4_ = uVar155;
  auVar264._12_4_ = uVar155;
  local_5e0._16_4_ = uVar155;
  local_5e0._0_16_ = auVar264;
  local_5e0._20_4_ = uVar155;
  local_5e0._24_4_ = uVar155;
  local_5e0._28_4_ = uVar155;
  auVar266 = ZEXT3264(local_5e0);
  auVar88 = vunpcklps_avx(auVar96,auVar264);
  fVar250 = *(float *)(ray + k * 4 + 0xc0);
  auVar267._4_4_ = fVar250;
  auVar267._0_4_ = fVar250;
  auVar267._8_4_ = fVar250;
  auVar267._12_4_ = fVar250;
  local_600._16_4_ = fVar250;
  local_600._0_16_ = auVar267;
  local_600._20_4_ = fVar250;
  local_600._24_4_ = fVar250;
  local_600._28_4_ = fVar250;
  local_890 = vinsertps_avx(auVar88,auVar267,0x28);
  auVar251 = ZEXT1664(local_890);
  auVar92._0_4_ = auVar12._0_4_ + auVar13._0_4_ + auVar90._0_4_ + auVar199._0_4_;
  auVar92._4_4_ = auVar12._4_4_ + auVar13._4_4_ + auVar90._4_4_ + auVar199._4_4_;
  auVar92._8_4_ = auVar12._8_4_ + auVar13._8_4_ + auVar90._8_4_ + auVar199._8_4_;
  auVar92._12_4_ = auVar12._12_4_ + auVar13._12_4_ + auVar90._12_4_ + auVar199._12_4_;
  auVar93._8_4_ = 0x3e800000;
  auVar93._0_8_ = 0x3e8000003e800000;
  auVar93._12_4_ = 0x3e800000;
  auVar88 = vmulps_avx512vl(auVar92,auVar93);
  auVar88 = vsubps_avx(auVar88,auVar1);
  auVar88 = vdpps_avx(auVar88,local_890,0x7f);
  fVar154 = *(float *)(ray + k * 4 + 0x60);
  auVar257 = ZEXT464((uint)fVar154);
  local_8a0 = vdpps_avx(local_890,local_890,0x7f);
  auVar259 = ZEXT1664(local_8a0);
  auVar94._4_12_ = ZEXT812(0) << 0x20;
  auVar94._0_4_ = local_8a0._0_4_;
  auVar89 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar94);
  auVar91 = vfnmadd213ss_fma(auVar89,local_8a0,ZEXT416(0x40000000));
  local_220 = auVar88._0_4_ * auVar89._0_4_ * auVar91._0_4_;
  auVar243 = ZEXT464((uint)local_220);
  auVar95._4_4_ = local_220;
  auVar95._0_4_ = local_220;
  auVar95._8_4_ = local_220;
  auVar95._12_4_ = local_220;
  fStack_730 = local_220;
  _local_740 = auVar95;
  fStack_72c = local_220;
  fStack_728 = local_220;
  fStack_724 = local_220;
  auVar88 = vfmadd231ps_fma(auVar1,local_890,auVar95);
  auVar88 = vblendps_avx(auVar88,ZEXT816(0) << 0x40,8);
  auVar12 = vsubps_avx(auVar12,auVar88);
  auVar90 = vsubps_avx(auVar90,auVar88);
  auVar13 = vsubps_avx(auVar13,auVar88);
  auVar249 = ZEXT1664(auVar13);
  auVar199 = vsubps_avx(auVar199,auVar88);
  local_240 = vbroadcastss_avx512vl(auVar12);
  auVar121._8_4_ = 1;
  auVar121._0_8_ = 0x100000001;
  auVar121._12_4_ = 1;
  auVar121._16_4_ = 1;
  auVar121._20_4_ = 1;
  auVar121._24_4_ = 1;
  auVar121._28_4_ = 1;
  local_820 = ZEXT1632(auVar12);
  local_260 = vpermps_avx512vl(auVar121,local_820);
  auVar122._8_4_ = 2;
  auVar122._0_8_ = 0x200000002;
  auVar122._12_4_ = 2;
  auVar122._16_4_ = 2;
  auVar122._20_4_ = 2;
  auVar122._24_4_ = 2;
  auVar122._28_4_ = 2;
  local_280 = vpermps_avx512vl(auVar122,local_820);
  auVar123._8_4_ = 3;
  auVar123._0_8_ = 0x300000003;
  auVar123._12_4_ = 3;
  auVar123._16_4_ = 3;
  auVar123._20_4_ = 3;
  auVar123._24_4_ = 3;
  auVar123._28_4_ = 3;
  local_2a0 = vpermps_avx512vl(auVar123,local_820);
  local_2c0 = vbroadcastss_avx512vl(auVar13);
  local_860 = ZEXT1632(auVar13);
  local_2e0 = vpermps_avx512vl(auVar121,local_860);
  local_300 = vpermps_avx512vl(auVar122,local_860);
  local_320 = vpermps_avx512vl(auVar123,local_860);
  local_340 = vbroadcastss_avx512vl(auVar90);
  local_840 = ZEXT1632(auVar90);
  local_360 = vpermps_avx512vl(auVar121,local_840);
  local_380 = vpermps_avx512vl(auVar122,local_840);
  local_3a0 = vpermps_avx512vl(auVar123,local_840);
  local_3c0 = vbroadcastss_avx512vl(auVar199);
  _local_880 = ZEXT1632(auVar199);
  _local_1e0 = vpermps_avx2(auVar121,_local_880);
  local_620 = vpermps_avx512vl(auVar122,_local_880);
  local_400 = vpermps_avx2(auVar123,_local_880);
  auVar12 = vfmadd231ps_fma(ZEXT432((uint)(fVar250 * fVar250)),local_5e0,local_5e0);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_5c0,local_5c0);
  uVar155 = auVar12._0_4_;
  local_200._4_4_ = uVar155;
  local_200._0_4_ = uVar155;
  local_200._8_4_ = uVar155;
  local_200._12_4_ = uVar155;
  local_200._16_4_ = uVar155;
  local_200._20_4_ = uVar155;
  local_200._24_4_ = uVar155;
  local_200._28_4_ = uVar155;
  vandps_avx512vl(local_200,auVar268._0_32_);
  local_7d0 = ZEXT416((uint)local_220);
  local_220 = fVar154 - local_220;
  fStack_21c = local_220;
  fStack_218 = local_220;
  fStack_214 = local_220;
  fStack_210 = local_220;
  fStack_20c = local_220;
  fStack_208 = local_220;
  fStack_204 = local_220;
  local_660 = vpbroadcastd_avx512vl();
  iVar82 = 1;
  bVar75 = 0;
  local_680 = vpbroadcastd_avx512vl();
  auVar12 = vsqrtss_avx(local_8a0,local_8a0);
  auVar13 = vsqrtss_avx(local_8a0,local_8a0);
  auVar216 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar230 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  local_3e0 = local_620;
  uVar74 = 0;
  do {
    auVar199 = auVar216._0_16_;
    auVar90 = vmovshdup_avx(auVar199);
    fVar250 = auVar216._0_4_;
    fVar260 = auVar90._0_4_ - fVar250;
    fVar247 = fVar260 * 0.04761905;
    auVar236._4_4_ = fVar250;
    auVar236._0_4_ = fVar250;
    auVar236._8_4_ = fVar250;
    auVar236._12_4_ = fVar250;
    auVar236._16_4_ = fVar250;
    auVar236._20_4_ = fVar250;
    auVar236._24_4_ = fVar250;
    auVar236._28_4_ = fVar250;
    local_8c0._4_4_ = fVar260;
    local_8c0._0_4_ = fVar260;
    local_8c0._8_4_ = fVar260;
    local_8c0._12_4_ = fVar260;
    local_8c0._16_4_ = fVar260;
    local_8c0._20_4_ = fVar260;
    local_8c0._24_4_ = fVar260;
    local_8c0._28_4_ = fVar260;
    auVar90 = vfmadd231ps_fma(auVar236,local_8c0,_DAT_02020f20);
    auVar102 = vsubps_avx(auVar230._0_32_,ZEXT1632(auVar90));
    fVar250 = auVar102._0_4_;
    fVar253 = auVar102._4_4_;
    fVar245 = auVar102._8_4_;
    fVar255 = auVar102._12_4_;
    fVar241 = auVar102._16_4_;
    fVar256 = auVar102._20_4_;
    fVar242 = auVar102._24_4_;
    fVar156 = fVar250 * fVar250 * fVar250;
    fVar174 = fVar253 * fVar253 * fVar253;
    auVar131._4_4_ = fVar174;
    auVar131._0_4_ = fVar156;
    fVar175 = fVar245 * fVar245 * fVar245;
    auVar131._8_4_ = fVar175;
    fVar176 = fVar255 * fVar255 * fVar255;
    auVar131._12_4_ = fVar176;
    fVar177 = fVar241 * fVar241 * fVar241;
    auVar131._16_4_ = fVar177;
    fVar178 = fVar256 * fVar256 * fVar256;
    auVar131._20_4_ = fVar178;
    fVar179 = fVar242 * fVar242 * fVar242;
    auVar131._24_4_ = fVar179;
    auVar131._28_4_ = fVar260;
    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar103 = vmulps_avx512vl(auVar131,auVar101);
    fVar252 = auVar90._0_4_;
    fVar254 = auVar90._4_4_;
    fVar246 = auVar90._8_4_;
    fVar220 = auVar90._12_4_;
    fVar198 = fVar252 * fVar252 * fVar252;
    fVar217 = fVar254 * fVar254 * fVar254;
    fVar218 = fVar246 * fVar246 * fVar246;
    fVar219 = fVar220 * fVar220 * fVar220;
    auVar268._28_36_ = auVar216._28_36_;
    auVar268._0_28_ = ZEXT1628(CONCAT412(fVar219,CONCAT48(fVar218,CONCAT44(fVar217,fVar198))));
    auVar230._0_4_ = fVar252 * fVar250;
    auVar230._4_4_ = fVar254 * fVar253;
    auVar230._8_4_ = fVar246 * fVar245;
    auVar230._12_4_ = fVar220 * fVar255;
    auVar230._16_4_ = fVar241 * 0.0;
    auVar230._20_4_ = fVar256 * 0.0;
    auVar230._28_36_ = auVar257._28_36_;
    auVar230._24_4_ = fVar242 * 0.0;
    auVar104 = vmulps_avx512vl(auVar268._0_32_,auVar101);
    fVar260 = auVar104._28_4_ + fVar260;
    fVar31 = auVar263._28_4_;
    fVar244 = fVar260 + fVar31 + auVar243._28_4_;
    auVar32._4_4_ = fVar174 * 0.16666667;
    auVar32._0_4_ = fVar156 * 0.16666667;
    auVar32._8_4_ = fVar175 * 0.16666667;
    auVar32._12_4_ = fVar176 * 0.16666667;
    auVar32._16_4_ = fVar177 * 0.16666667;
    auVar32._20_4_ = fVar178 * 0.16666667;
    auVar32._24_4_ = fVar179 * 0.16666667;
    auVar32._28_4_ = fVar260;
    auVar33._4_4_ =
         (auVar230._4_4_ * fVar253 * 12.0 + auVar230._4_4_ * fVar254 * 6.0 +
         fVar217 + auVar103._4_4_) * 0.16666667;
    auVar33._0_4_ =
         (auVar230._0_4_ * fVar250 * 12.0 + auVar230._0_4_ * fVar252 * 6.0 +
         fVar198 + auVar103._0_4_) * 0.16666667;
    auVar33._8_4_ =
         (auVar230._8_4_ * fVar245 * 12.0 + auVar230._8_4_ * fVar246 * 6.0 +
         fVar218 + auVar103._8_4_) * 0.16666667;
    auVar33._12_4_ =
         (auVar230._12_4_ * fVar255 * 12.0 + auVar230._12_4_ * fVar220 * 6.0 +
         fVar219 + auVar103._12_4_) * 0.16666667;
    auVar33._16_4_ =
         (auVar230._16_4_ * fVar241 * 12.0 + auVar230._16_4_ * 0.0 * 6.0 + auVar103._16_4_ + 0.0) *
         0.16666667;
    auVar33._20_4_ =
         (auVar230._20_4_ * fVar256 * 12.0 + auVar230._20_4_ * 0.0 * 6.0 + auVar103._20_4_ + 0.0) *
         0.16666667;
    auVar33._24_4_ =
         (auVar230._24_4_ * fVar242 * 12.0 + auVar230._24_4_ * 0.0 * 6.0 + auVar103._24_4_ + 0.0) *
         0.16666667;
    auVar33._28_4_ = fVar31;
    auVar34._4_4_ =
         (auVar104._4_4_ + fVar174 +
         auVar230._4_4_ * fVar254 * 12.0 + auVar230._4_4_ * fVar253 * 6.0) * 0.16666667;
    auVar34._0_4_ =
         (auVar104._0_4_ + fVar156 +
         auVar230._0_4_ * fVar252 * 12.0 + auVar230._0_4_ * fVar250 * 6.0) * 0.16666667;
    auVar34._8_4_ =
         (auVar104._8_4_ + fVar175 +
         auVar230._8_4_ * fVar246 * 12.0 + auVar230._8_4_ * fVar245 * 6.0) * 0.16666667;
    auVar34._12_4_ =
         (auVar104._12_4_ + fVar176 +
         auVar230._12_4_ * fVar220 * 12.0 + auVar230._12_4_ * fVar255 * 6.0) * 0.16666667;
    auVar34._16_4_ =
         (auVar104._16_4_ + fVar177 + auVar230._16_4_ * 0.0 * 12.0 + auVar230._16_4_ * fVar241 * 6.0
         ) * 0.16666667;
    auVar34._20_4_ =
         (auVar104._20_4_ + fVar178 + auVar230._20_4_ * 0.0 * 12.0 + auVar230._20_4_ * fVar256 * 6.0
         ) * 0.16666667;
    auVar34._24_4_ =
         (auVar104._24_4_ + fVar179 + auVar230._24_4_ * 0.0 * 12.0 + auVar230._24_4_ * fVar242 * 6.0
         ) * 0.16666667;
    auVar34._28_4_ = auVar266._28_4_;
    fVar198 = fVar198 * 0.16666667;
    fVar217 = fVar217 * 0.16666667;
    fVar218 = fVar218 * 0.16666667;
    fVar219 = fVar219 * 0.16666667;
    auVar35._28_4_ = fVar244;
    auVar35._0_28_ = ZEXT1628(CONCAT412(fVar219,CONCAT48(fVar218,CONCAT44(fVar217,fVar198))));
    auVar104 = vmulps_avx512vl(local_3c0,auVar35);
    auVar36._4_4_ = (float)local_1e0._4_4_ * fVar217;
    auVar36._0_4_ = (float)local_1e0._0_4_ * fVar198;
    auVar36._8_4_ = fStack_1d8 * fVar218;
    auVar36._12_4_ = fStack_1d4 * fVar219;
    auVar36._16_4_ = fStack_1d0 * 0.0;
    auVar36._20_4_ = fStack_1cc * 0.0;
    auVar36._24_4_ = fStack_1c8 * 0.0;
    auVar36._28_4_ = auVar259._28_4_ + auVar266._28_4_ + auVar216._28_4_ + auVar103._28_4_;
    auVar103 = vmulps_avx512vl(local_3e0,auVar35);
    auVar37._4_4_ = local_400._4_4_ * fVar217;
    auVar37._0_4_ = local_400._0_4_ * fVar198;
    auVar37._8_4_ = local_400._8_4_ * fVar218;
    auVar37._12_4_ = local_400._12_4_ * fVar219;
    auVar37._16_4_ = local_400._16_4_ * 0.0;
    auVar37._20_4_ = local_400._20_4_ * 0.0;
    auVar37._24_4_ = local_400._24_4_ * 0.0;
    auVar37._28_4_ = fVar244;
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar34,local_340);
    auVar105 = vfmadd231ps_avx512vl(auVar36,auVar34,local_360);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar34,local_380);
    auVar106 = vfmadd231ps_avx512vl(auVar37,local_3a0,auVar34);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar33,local_2c0);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar33,local_2e0);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar33,local_300);
    auVar106 = vfmadd231ps_avx512vl(auVar106,local_320,auVar33);
    auVar107 = vfmadd231ps_avx512vl(auVar104,auVar32,local_240);
    auVar108 = vfmadd231ps_avx512vl(auVar105,auVar32,local_260);
    auVar109 = vfmadd231ps_avx512vl(auVar103,auVar32,local_280);
    auVar103 = vfmadd231ps_avx512vl(auVar106,local_2a0,auVar32);
    auVar104 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar105 = vxorps_avx512vl(auVar102,auVar104);
    auVar104 = vxorps_avx512vl(ZEXT1632(auVar90),auVar104);
    auVar237._0_4_ = auVar104._0_4_ * fVar252;
    auVar237._4_4_ = auVar104._4_4_ * fVar254;
    auVar237._8_4_ = auVar104._8_4_ * fVar246;
    auVar237._12_4_ = auVar104._12_4_ * fVar220;
    auVar237._16_4_ = auVar104._16_4_ * 0.0;
    auVar237._20_4_ = auVar104._20_4_ * 0.0;
    auVar237._24_4_ = auVar104._24_4_ * 0.0;
    auVar237._28_4_ = 0;
    auVar106 = vmulps_avx512vl(auVar230._0_32_,auVar101);
    auVar101 = vsubps_avx(auVar237,auVar106);
    auVar38._4_4_ = auVar105._4_4_ * fVar253 * 0.5;
    auVar38._0_4_ = auVar105._0_4_ * fVar250 * 0.5;
    auVar38._8_4_ = auVar105._8_4_ * fVar245 * 0.5;
    auVar38._12_4_ = auVar105._12_4_ * fVar255 * 0.5;
    auVar38._16_4_ = auVar105._16_4_ * fVar241 * 0.5;
    auVar38._20_4_ = auVar105._20_4_ * fVar256 * 0.5;
    auVar38._24_4_ = auVar105._24_4_ * fVar242 * 0.5;
    auVar38._28_4_ = auVar102._28_4_;
    auVar39._4_4_ = auVar101._4_4_ * 0.5;
    auVar39._0_4_ = auVar101._0_4_ * 0.5;
    auVar39._8_4_ = auVar101._8_4_ * 0.5;
    auVar39._12_4_ = auVar101._12_4_ * 0.5;
    auVar39._16_4_ = auVar101._16_4_ * 0.5;
    auVar39._20_4_ = auVar101._20_4_ * 0.5;
    auVar39._24_4_ = auVar101._24_4_ * 0.5;
    auVar39._28_4_ = auVar101._28_4_;
    auVar40._4_4_ = (fVar253 * fVar253 + auVar106._4_4_) * 0.5;
    auVar40._0_4_ = (fVar250 * fVar250 + auVar106._0_4_) * 0.5;
    auVar40._8_4_ = (fVar245 * fVar245 + auVar106._8_4_) * 0.5;
    auVar40._12_4_ = (fVar255 * fVar255 + auVar106._12_4_) * 0.5;
    auVar40._16_4_ = (fVar241 * fVar241 + auVar106._16_4_) * 0.5;
    auVar40._20_4_ = (fVar256 * fVar256 + auVar106._20_4_) * 0.5;
    auVar40._24_4_ = (fVar242 * fVar242 + auVar106._24_4_) * 0.5;
    auVar40._28_4_ = auVar249._28_4_ + auVar106._28_4_;
    fVar250 = fVar252 * fVar252 * 0.5;
    fVar252 = fVar254 * fVar254 * 0.5;
    fVar253 = fVar246 * fVar246 * 0.5;
    fVar254 = fVar220 * fVar220 * 0.5;
    auVar41._28_4_ = auVar251._28_4_;
    auVar41._0_28_ = ZEXT1628(CONCAT412(fVar254,CONCAT48(fVar253,CONCAT44(fVar252,fVar250))));
    auVar102 = vmulps_avx512vl(local_3c0,auVar41);
    auVar42._4_4_ = fVar252 * (float)local_1e0._4_4_;
    auVar42._0_4_ = fVar250 * (float)local_1e0._0_4_;
    auVar42._8_4_ = fVar253 * fStack_1d8;
    auVar42._12_4_ = fVar254 * fStack_1d4;
    auVar42._16_4_ = fStack_1d0 * 0.0;
    auVar42._20_4_ = fStack_1cc * 0.0;
    auVar42._24_4_ = fStack_1c8 * 0.0;
    auVar42._28_4_ = fVar31;
    auVar101 = vmulps_avx512vl(local_3e0,auVar41);
    auVar43._4_4_ = fVar252 * local_400._4_4_;
    auVar43._0_4_ = fVar250 * local_400._0_4_;
    auVar43._8_4_ = fVar253 * local_400._8_4_;
    auVar43._12_4_ = fVar254 * local_400._12_4_;
    auVar43._16_4_ = local_400._16_4_ * 0.0;
    auVar43._20_4_ = local_400._20_4_ * 0.0;
    auVar43._24_4_ = local_400._24_4_ * 0.0;
    auVar43._28_4_ = auVar251._28_4_;
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar40,local_340);
    auVar105 = vfmadd231ps_avx512vl(auVar42,auVar40,local_360);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar40,local_380);
    auVar106 = vfmadd231ps_avx512vl(auVar43,local_3a0,auVar40);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar39,local_2c0);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar39,local_2e0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar39,local_300);
    auVar106 = vfmadd231ps_avx512vl(auVar106,local_320,auVar39);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar38,local_240);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar38,local_260);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar38,local_280);
    auVar106 = vfmadd231ps_avx512vl(auVar106,local_2a0,auVar38);
    auVar44._4_4_ = auVar102._4_4_ * fVar247;
    auVar44._0_4_ = auVar102._0_4_ * fVar247;
    auVar44._8_4_ = auVar102._8_4_ * fVar247;
    auVar44._12_4_ = auVar102._12_4_ * fVar247;
    auVar44._16_4_ = auVar102._16_4_ * fVar247;
    auVar44._20_4_ = auVar102._20_4_ * fVar247;
    auVar44._24_4_ = auVar102._24_4_ * fVar247;
    auVar44._28_4_ = auVar104._28_4_;
    auVar259 = ZEXT3264(auVar44);
    auVar45._4_4_ = auVar105._4_4_ * fVar247;
    auVar45._0_4_ = auVar105._0_4_ * fVar247;
    auVar45._8_4_ = auVar105._8_4_ * fVar247;
    auVar45._12_4_ = auVar105._12_4_ * fVar247;
    auVar45._16_4_ = auVar105._16_4_ * fVar247;
    auVar45._20_4_ = auVar105._20_4_ * fVar247;
    auVar45._24_4_ = auVar105._24_4_ * fVar247;
    auVar45._28_4_ = auVar105._28_4_;
    auVar263 = ZEXT3264(auVar45);
    auVar46._4_4_ = auVar101._4_4_ * fVar247;
    auVar46._0_4_ = auVar101._0_4_ * fVar247;
    auVar46._8_4_ = auVar101._8_4_ * fVar247;
    auVar46._12_4_ = auVar101._12_4_ * fVar247;
    auVar46._16_4_ = auVar101._16_4_ * fVar247;
    auVar46._20_4_ = auVar101._20_4_ * fVar247;
    auVar46._24_4_ = auVar101._24_4_ * fVar247;
    auVar46._28_4_ = auVar101._28_4_;
    auVar266 = ZEXT3264(auVar46);
    fVar250 = auVar106._0_4_ * fVar247;
    fVar252 = auVar106._4_4_ * fVar247;
    auVar47._4_4_ = fVar252;
    auVar47._0_4_ = fVar250;
    fVar253 = auVar106._8_4_ * fVar247;
    auVar47._8_4_ = fVar253;
    fVar254 = auVar106._12_4_ * fVar247;
    auVar47._12_4_ = fVar254;
    fVar245 = auVar106._16_4_ * fVar247;
    auVar47._16_4_ = fVar245;
    fVar246 = auVar106._20_4_ * fVar247;
    auVar47._20_4_ = fVar246;
    fVar247 = auVar106._24_4_ * fVar247;
    auVar47._24_4_ = fVar247;
    auVar47._28_4_ = local_400._28_4_;
    auVar90 = vxorps_avx512vl(local_3a0._0_16_,local_3a0._0_16_);
    auVar106 = vpermt2ps_avx512vl(auVar107,_DAT_0205fd20,ZEXT1632(auVar90));
    auVar249 = ZEXT3264(auVar106);
    auVar110 = vpermt2ps_avx512vl(auVar108,_DAT_0205fd20,ZEXT1632(auVar90));
    auVar251 = ZEXT3264(auVar110);
    auVar104 = ZEXT1632(auVar90);
    auVar99 = vpermt2ps_avx512vl(auVar109,_DAT_0205fd20,auVar104);
    auVar257 = ZEXT3264(auVar99);
    auVar238._0_4_ = fVar250 + auVar103._0_4_;
    auVar238._4_4_ = fVar252 + auVar103._4_4_;
    auVar238._8_4_ = fVar253 + auVar103._8_4_;
    auVar238._12_4_ = fVar254 + auVar103._12_4_;
    auVar238._16_4_ = fVar245 + auVar103._16_4_;
    auVar238._20_4_ = fVar246 + auVar103._20_4_;
    auVar238._24_4_ = fVar247 + auVar103._24_4_;
    auVar238._28_4_ = local_400._28_4_ + auVar103._28_4_;
    auVar102 = vmaxps_avx(auVar103,auVar238);
    auVar101 = vminps_avx(auVar103,auVar238);
    auVar100 = vpermt2ps_avx512vl(auVar103,_DAT_0205fd20,auVar104);
    auVar111 = vpermt2ps_avx512vl(auVar44,_DAT_0205fd20,auVar104);
    auVar97 = vpermt2ps_avx512vl(auVar45,_DAT_0205fd20,auVar104);
    auVar131 = ZEXT1632(auVar90);
    auVar98 = vpermt2ps_avx512vl(auVar46,_DAT_0205fd20,auVar131);
    auVar103 = vpermt2ps_avx512vl(auVar47,_DAT_0205fd20,auVar131);
    auVar112 = vsubps_avx512vl(auVar100,auVar103);
    auVar103 = vsubps_avx(auVar106,auVar107);
    auVar104 = vsubps_avx(auVar110,auVar108);
    auVar105 = vsubps_avx(auVar99,auVar109);
    auVar243 = ZEXT3264(auVar105);
    auVar113 = vmulps_avx512vl(auVar104,auVar46);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar45,auVar105);
    auVar114 = vmulps_avx512vl(auVar105,auVar44);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar46,auVar103);
    auVar115 = vmulps_avx512vl(auVar103,auVar45);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar44,auVar104);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar114 = vmulps_avx512vl(auVar105,auVar105);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar104,auVar104);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar103,auVar103);
    auVar115 = vrcp14ps_avx512vl(auVar114);
    auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar117 = vfnmadd213ps_avx512vl(auVar115,auVar114,auVar116);
    auVar115 = vfmadd132ps_avx512vl(auVar117,auVar115,auVar115);
    auVar113 = vmulps_avx512vl(auVar113,auVar115);
    auVar117 = vmulps_avx512vl(auVar104,auVar98);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar97,auVar105);
    auVar118 = vmulps_avx512vl(auVar105,auVar111);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar98,auVar103);
    auVar119 = vmulps_avx512vl(auVar103,auVar97);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar111,auVar104);
    auVar119 = vmulps_avx512vl(auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar115 = vmulps_avx512vl(auVar117,auVar115);
    auVar113 = vmaxps_avx512vl(auVar113,auVar115);
    auVar113 = vsqrtps_avx512vl(auVar113);
    auVar115 = vmaxps_avx512vl(auVar112,auVar100);
    auVar102 = vmaxps_avx512vl(auVar102,auVar115);
    auVar115 = vaddps_avx512vl(auVar113,auVar102);
    auVar102 = vminps_avx512vl(auVar112,auVar100);
    auVar102 = vminps_avx(auVar101,auVar102);
    auVar102 = vsubps_avx512vl(auVar102,auVar113);
    auVar124._8_4_ = 0x3f800002;
    auVar124._0_8_ = 0x3f8000023f800002;
    auVar124._12_4_ = 0x3f800002;
    auVar124._16_4_ = 0x3f800002;
    auVar124._20_4_ = 0x3f800002;
    auVar124._24_4_ = 0x3f800002;
    auVar124._28_4_ = 0x3f800002;
    auVar101 = vmulps_avx512vl(auVar115,auVar124);
    auVar125._8_4_ = 0x3f7ffffc;
    auVar125._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar125._12_4_ = 0x3f7ffffc;
    auVar125._16_4_ = 0x3f7ffffc;
    auVar125._20_4_ = 0x3f7ffffc;
    auVar125._24_4_ = 0x3f7ffffc;
    auVar125._28_4_ = 0x3f7ffffc;
    auVar100 = vmulps_avx512vl(auVar102,auVar125);
    auVar48._4_4_ = auVar101._4_4_ * auVar101._4_4_;
    auVar48._0_4_ = auVar101._0_4_ * auVar101._0_4_;
    auVar48._8_4_ = auVar101._8_4_ * auVar101._8_4_;
    auVar48._12_4_ = auVar101._12_4_ * auVar101._12_4_;
    auVar48._16_4_ = auVar101._16_4_ * auVar101._16_4_;
    auVar48._20_4_ = auVar101._20_4_ * auVar101._20_4_;
    auVar48._24_4_ = auVar101._24_4_ * auVar101._24_4_;
    auVar48._28_4_ = auVar100._28_4_;
    auVar102 = vrsqrt14ps_avx512vl(auVar114);
    auVar128._8_4_ = 0xbf000000;
    auVar128._0_8_ = 0xbf000000bf000000;
    auVar128._12_4_ = 0xbf000000;
    auVar128._16_4_ = 0xbf000000;
    auVar128._20_4_ = 0xbf000000;
    auVar128._24_4_ = 0xbf000000;
    auVar128._28_4_ = 0xbf000000;
    auVar101 = vmulps_avx512vl(auVar114,auVar128);
    auVar49._4_4_ = auVar102._4_4_ * auVar101._4_4_;
    auVar49._0_4_ = auVar102._0_4_ * auVar101._0_4_;
    auVar49._8_4_ = auVar102._8_4_ * auVar101._8_4_;
    auVar49._12_4_ = auVar102._12_4_ * auVar101._12_4_;
    auVar49._16_4_ = auVar102._16_4_ * auVar101._16_4_;
    auVar49._20_4_ = auVar102._20_4_ * auVar101._20_4_;
    auVar49._24_4_ = auVar102._24_4_ * auVar101._24_4_;
    auVar49._28_4_ = auVar101._28_4_;
    auVar101 = vmulps_avx512vl(auVar102,auVar102);
    auVar101 = vmulps_avx512vl(auVar101,auVar49);
    auVar129._8_4_ = 0x3fc00000;
    auVar129._0_8_ = 0x3fc000003fc00000;
    auVar129._12_4_ = 0x3fc00000;
    auVar129._16_4_ = 0x3fc00000;
    auVar129._20_4_ = 0x3fc00000;
    auVar129._24_4_ = 0x3fc00000;
    auVar129._28_4_ = 0x3fc00000;
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar102,auVar129);
    auVar50._4_4_ = auVar101._4_4_ * auVar103._4_4_;
    auVar50._0_4_ = auVar101._0_4_ * auVar103._0_4_;
    auVar50._8_4_ = auVar101._8_4_ * auVar103._8_4_;
    auVar50._12_4_ = auVar101._12_4_ * auVar103._12_4_;
    auVar50._16_4_ = auVar101._16_4_ * auVar103._16_4_;
    auVar50._20_4_ = auVar101._20_4_ * auVar103._20_4_;
    auVar50._24_4_ = auVar101._24_4_ * auVar103._24_4_;
    auVar50._28_4_ = auVar102._28_4_;
    auVar102 = vmulps_avx512vl(auVar104,auVar101);
    auVar112 = vmulps_avx512vl(auVar105,auVar101);
    auVar113 = vsubps_avx512vl(auVar131,auVar107);
    auVar114 = vsubps_avx512vl(auVar131,auVar108);
    auVar115 = vsubps_avx512vl(auVar131,auVar109);
    auVar117 = vmulps_avx512vl(local_600,auVar115);
    auVar117 = vfmadd231ps_avx512vl(auVar117,local_5e0,auVar114);
    auVar117 = vfmadd231ps_avx512vl(auVar117,local_5c0,auVar113);
    auVar118 = vmulps_avx512vl(auVar115,auVar115);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar114,auVar114);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar113,auVar113);
    auVar119 = vmulps_avx512vl(local_600,auVar112);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar102,local_5e0);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar50,local_5c0);
    auVar112 = vmulps_avx512vl(auVar115,auVar112);
    auVar102 = vfmadd231ps_avx512vl(auVar112,auVar114,auVar102);
    auVar112 = vfmadd231ps_avx512vl(auVar102,auVar113,auVar50);
    auVar120 = vmulps_avx512vl(auVar119,auVar119);
    auVar121 = vsubps_avx512vl(local_200,auVar120);
    auVar102 = vmulps_avx512vl(auVar119,auVar112);
    auVar102 = vsubps_avx512vl(auVar117,auVar102);
    auVar117 = vaddps_avx512vl(auVar102,auVar102);
    auVar102 = vmulps_avx512vl(auVar112,auVar112);
    local_8e0 = vsubps_avx512vl(auVar118,auVar102);
    auVar102 = vsubps_avx(local_8e0,auVar48);
    auVar118 = vmulps_avx512vl(auVar117,auVar117);
    auVar130._8_4_ = 0x40800000;
    auVar130._0_8_ = 0x4080000040800000;
    auVar130._12_4_ = 0x40800000;
    auVar130._16_4_ = 0x40800000;
    auVar130._20_4_ = 0x40800000;
    auVar130._24_4_ = 0x40800000;
    auVar130._28_4_ = 0x40800000;
    auVar122 = vmulps_avx512vl(auVar121,auVar130);
    auVar123 = vmulps_avx512vl(auVar122,auVar102);
    auVar123 = vsubps_avx512vl(auVar118,auVar123);
    uVar86 = vcmpps_avx512vl(auVar123,auVar131,5);
    bVar71 = (byte)uVar86;
    if (bVar71 == 0) {
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar123 = vsqrtps_avx512vl(auVar123);
      auVar124 = vaddps_avx512vl(auVar121,auVar121);
      auVar125 = vrcp14ps_avx512vl(auVar124);
      auVar124 = vfnmadd213ps_avx512vl(auVar124,auVar125,auVar116);
      auVar124 = vfmadd132ps_avx512vl(auVar124,auVar125,auVar125);
      auVar20._8_4_ = 0x80000000;
      auVar20._0_8_ = 0x8000000080000000;
      auVar20._12_4_ = 0x80000000;
      auVar20._16_4_ = 0x80000000;
      auVar20._20_4_ = 0x80000000;
      auVar20._24_4_ = 0x80000000;
      auVar20._28_4_ = 0x80000000;
      auVar125 = vxorps_avx512vl(auVar117,auVar20);
      auVar125 = vsubps_avx512vl(auVar125,auVar123);
      auVar125 = vmulps_avx512vl(auVar125,auVar124);
      auVar123 = vsubps_avx512vl(auVar123,auVar117);
      auVar123 = vmulps_avx512vl(auVar123,auVar124);
      auVar124 = vfmadd213ps_avx512vl(auVar119,auVar125,auVar112);
      local_6c0 = vmulps_avx512vl(auVar101,auVar124);
      auVar124 = vfmadd213ps_avx512vl(auVar119,auVar123,auVar112);
      local_6e0 = vmulps_avx512vl(auVar101,auVar124);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar124 = vblendmps_avx512vl(auVar124,auVar125);
      auVar126._0_4_ =
           (uint)(bVar71 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar71 & 1) * local_6e0._0_4_;
      bVar84 = (bool)((byte)(uVar86 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar84 * auVar124._4_4_ | (uint)!bVar84 * local_6e0._4_4_;
      bVar84 = (bool)((byte)(uVar86 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar84 * auVar124._8_4_ | (uint)!bVar84 * local_6e0._8_4_;
      bVar84 = (bool)((byte)(uVar86 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar84 * auVar124._12_4_ | (uint)!bVar84 * local_6e0._12_4_;
      bVar84 = (bool)((byte)(uVar86 >> 4) & 1);
      auVar126._16_4_ = (uint)bVar84 * auVar124._16_4_ | (uint)!bVar84 * local_6e0._16_4_;
      bVar84 = (bool)((byte)(uVar86 >> 5) & 1);
      auVar126._20_4_ = (uint)bVar84 * auVar124._20_4_ | (uint)!bVar84 * local_6e0._20_4_;
      bVar84 = (bool)((byte)(uVar86 >> 6) & 1);
      auVar126._24_4_ = (uint)bVar84 * auVar124._24_4_ | (uint)!bVar84 * local_6e0._24_4_;
      bVar84 = SUB81(uVar86 >> 7,0);
      auVar126._28_4_ = (uint)bVar84 * auVar124._28_4_ | (uint)!bVar84 * local_6e0._28_4_;
      auVar225._8_4_ = 0xff800000;
      auVar225._0_8_ = 0xff800000ff800000;
      auVar225._12_4_ = 0xff800000;
      auVar225._16_4_ = 0xff800000;
      auVar225._20_4_ = 0xff800000;
      auVar225._24_4_ = 0xff800000;
      auVar225._28_4_ = 0xff800000;
      auVar124 = vblendmps_avx512vl(auVar225,auVar123);
      auVar127._0_4_ =
           (uint)(bVar71 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar123._0_4_;
      bVar84 = (bool)((byte)(uVar86 >> 1) & 1);
      auVar127._4_4_ = (uint)bVar84 * auVar124._4_4_ | (uint)!bVar84 * auVar123._4_4_;
      bVar84 = (bool)((byte)(uVar86 >> 2) & 1);
      auVar127._8_4_ = (uint)bVar84 * auVar124._8_4_ | (uint)!bVar84 * auVar123._8_4_;
      bVar84 = (bool)((byte)(uVar86 >> 3) & 1);
      auVar127._12_4_ = (uint)bVar84 * auVar124._12_4_ | (uint)!bVar84 * auVar123._12_4_;
      bVar84 = (bool)((byte)(uVar86 >> 4) & 1);
      auVar127._16_4_ = (uint)bVar84 * auVar124._16_4_ | (uint)!bVar84 * auVar123._16_4_;
      bVar84 = (bool)((byte)(uVar86 >> 5) & 1);
      auVar127._20_4_ = (uint)bVar84 * auVar124._20_4_ | (uint)!bVar84 * auVar123._20_4_;
      bVar84 = (bool)((byte)(uVar86 >> 6) & 1);
      auVar127._24_4_ = (uint)bVar84 * auVar124._24_4_ | (uint)!bVar84 * auVar123._24_4_;
      bVar84 = SUB81(uVar86 >> 7,0);
      auVar127._28_4_ = (uint)bVar84 * auVar124._28_4_ | (uint)!bVar84 * auVar123._28_4_;
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar120,auVar123);
      auVar124 = vmaxps_avx512vl(local_620,auVar123);
      auVar21._8_4_ = 0x36000000;
      auVar21._0_8_ = 0x3600000036000000;
      auVar21._12_4_ = 0x36000000;
      auVar21._16_4_ = 0x36000000;
      auVar21._20_4_ = 0x36000000;
      auVar21._24_4_ = 0x36000000;
      auVar21._28_4_ = 0x36000000;
      auVar124 = vmulps_avx512vl(auVar124,auVar21);
      vandps_avx512vl(auVar121,auVar123);
      uVar76 = vcmpps_avx512vl(auVar124,auVar124,1);
      uVar86 = uVar86 & uVar76;
      bVar78 = (byte)uVar86;
      if (bVar78 != 0) {
        uVar76 = vcmpps_avx512vl(auVar102,_DAT_02020f00,2);
        auVar240._8_4_ = 0xff800000;
        auVar240._0_8_ = 0xff800000ff800000;
        auVar240._12_4_ = 0xff800000;
        auVar240._16_4_ = 0xff800000;
        auVar240._20_4_ = 0xff800000;
        auVar240._24_4_ = 0xff800000;
        auVar240._28_4_ = 0xff800000;
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar123 = vblendmps_avx512vl(auVar102,auVar240);
        bVar73 = (byte)uVar76;
        uVar87 = (uint)(bVar73 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar124._0_4_;
        bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
        uVar147 = (uint)bVar84 * auVar123._4_4_ | (uint)!bVar84 * auVar124._4_4_;
        bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
        uVar148 = (uint)bVar84 * auVar123._8_4_ | (uint)!bVar84 * auVar124._8_4_;
        bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
        uVar149 = (uint)bVar84 * auVar123._12_4_ | (uint)!bVar84 * auVar124._12_4_;
        bVar84 = (bool)((byte)(uVar76 >> 4) & 1);
        uVar150 = (uint)bVar84 * auVar123._16_4_ | (uint)!bVar84 * auVar124._16_4_;
        bVar84 = (bool)((byte)(uVar76 >> 5) & 1);
        uVar151 = (uint)bVar84 * auVar123._20_4_ | (uint)!bVar84 * auVar124._20_4_;
        bVar84 = (bool)((byte)(uVar76 >> 6) & 1);
        uVar152 = (uint)bVar84 * auVar123._24_4_ | (uint)!bVar84 * auVar124._24_4_;
        bVar84 = SUB81(uVar76 >> 7,0);
        uVar153 = (uint)bVar84 * auVar123._28_4_ | (uint)!bVar84 * auVar124._28_4_;
        auVar126._0_4_ = (bVar78 & 1) * uVar87 | !(bool)(bVar78 & 1) * auVar126._0_4_;
        bVar84 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar126._4_4_ = bVar84 * uVar147 | !bVar84 * auVar126._4_4_;
        bVar84 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar126._8_4_ = bVar84 * uVar148 | !bVar84 * auVar126._8_4_;
        bVar84 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar126._12_4_ = bVar84 * uVar149 | !bVar84 * auVar126._12_4_;
        bVar84 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar126._16_4_ = bVar84 * uVar150 | !bVar84 * auVar126._16_4_;
        bVar84 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar126._20_4_ = bVar84 * uVar151 | !bVar84 * auVar126._20_4_;
        bVar84 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar126._24_4_ = bVar84 * uVar152 | !bVar84 * auVar126._24_4_;
        bVar84 = SUB81(uVar86 >> 7,0);
        auVar126._28_4_ = bVar84 * uVar153 | !bVar84 * auVar126._28_4_;
        auVar102 = vblendmps_avx512vl(auVar240,auVar102);
        bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar76 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar76 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar76 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar76 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar76 >> 6) & 1);
        bVar11 = SUB81(uVar76 >> 7,0);
        auVar127._0_4_ =
             (uint)(bVar78 & 1) *
             ((uint)(bVar73 & 1) * auVar102._0_4_ | !(bool)(bVar73 & 1) * uVar87) |
             !(bool)(bVar78 & 1) * auVar127._0_4_;
        bVar5 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar127._4_4_ =
             (uint)bVar5 * ((uint)bVar84 * auVar102._4_4_ | !bVar84 * uVar147) |
             !bVar5 * auVar127._4_4_;
        bVar84 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar127._8_4_ =
             (uint)bVar84 * ((uint)bVar6 * auVar102._8_4_ | !bVar6 * uVar148) |
             !bVar84 * auVar127._8_4_;
        bVar84 = (bool)((byte)(uVar86 >> 3) & 1);
        auVar127._12_4_ =
             (uint)bVar84 * ((uint)bVar7 * auVar102._12_4_ | !bVar7 * uVar149) |
             !bVar84 * auVar127._12_4_;
        bVar84 = (bool)((byte)(uVar86 >> 4) & 1);
        auVar127._16_4_ =
             (uint)bVar84 * ((uint)bVar8 * auVar102._16_4_ | !bVar8 * uVar150) |
             !bVar84 * auVar127._16_4_;
        bVar84 = (bool)((byte)(uVar86 >> 5) & 1);
        auVar127._20_4_ =
             (uint)bVar84 * ((uint)bVar9 * auVar102._20_4_ | !bVar9 * uVar151) |
             !bVar84 * auVar127._20_4_;
        bVar84 = (bool)((byte)(uVar86 >> 6) & 1);
        auVar127._24_4_ =
             (uint)bVar84 * ((uint)bVar10 * auVar102._24_4_ | !bVar10 * uVar152) |
             !bVar84 * auVar127._24_4_;
        bVar84 = SUB81(uVar86 >> 7,0);
        auVar127._28_4_ =
             (uint)bVar84 * ((uint)bVar11 * auVar102._28_4_ | !bVar11 * uVar153) |
             !bVar84 * auVar127._28_4_;
        bVar71 = (~bVar78 | bVar73) & bVar71;
      }
      auVar116._8_4_ = 0x3f800000;
      auVar116._0_8_ = &DAT_3f8000003f800000;
      auVar116._12_4_ = 0x3f800000;
      auVar116._16_4_ = 0x3f800000;
      auVar116._20_4_ = 0x3f800000;
      auVar116._24_4_ = 0x3f800000;
      auVar116._28_4_ = 0x3f800000;
    }
    auVar230 = ZEXT3264(auVar116);
    if ((bVar71 & 0x7f) == 0) {
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar268 = ZEXT3264(auVar102);
      auVar216 = ZEXT1664(auVar199);
    }
    else {
      fVar250 = *(float *)(ray + k * 4 + 0x100) - (float)local_7d0._0_4_;
      auVar226._4_4_ = fVar250;
      auVar226._0_4_ = fVar250;
      auVar226._8_4_ = fVar250;
      auVar226._12_4_ = fVar250;
      auVar226._16_4_ = fVar250;
      auVar226._20_4_ = fVar250;
      auVar226._24_4_ = fVar250;
      auVar226._28_4_ = fVar250;
      auVar123 = vminps_avx512vl(auVar226,auVar127);
      auVar70._4_4_ = fStack_21c;
      auVar70._0_4_ = local_220;
      auVar70._8_4_ = fStack_218;
      auVar70._12_4_ = fStack_214;
      auVar70._16_4_ = fStack_210;
      auVar70._20_4_ = fStack_20c;
      auVar70._24_4_ = fStack_208;
      auVar70._28_4_ = fStack_204;
      auVar102 = vmaxps_avx512vl(auVar70,auVar126);
      auVar115 = vmulps_avx512vl(auVar46,auVar115);
      auVar114 = vfmadd213ps_avx512vl(auVar114,auVar45,auVar115);
      auVar113 = vfmadd213ps_avx512vl(auVar113,auVar44,auVar114);
      auVar114 = vmulps_avx512vl(local_600,auVar46);
      auVar114 = vfmadd231ps_avx512vl(auVar114,local_5e0,auVar45);
      auVar114 = vfmadd231ps_avx512vl(auVar114,local_5c0,auVar44);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar268 = ZEXT3264(auVar115);
      vandps_avx512vl(auVar114,auVar115);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar115,auVar124,1);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar113 = vxorps_avx512vl(auVar113,auVar125);
      auVar128 = vrcp14ps_avx512vl(auVar114);
      auVar129 = vxorps_avx512vl(auVar114,auVar125);
      auVar130 = vfnmadd213ps_avx512vl(auVar128,auVar114,auVar116);
      auVar130 = vfmadd132ps_avx512vl(auVar130,auVar128,auVar128);
      auVar113 = vmulps_avx512vl(auVar130,auVar113);
      uVar16 = vcmpps_avx512vl(auVar114,auVar129,1);
      bVar78 = (byte)uVar14 | (byte)uVar16;
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar131 = vblendmps_avx512vl(auVar113,auVar130);
      auVar132._0_4_ =
           (uint)(bVar78 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar128._0_4_;
      bVar84 = (bool)(bVar78 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar84 * auVar131._4_4_ | (uint)!bVar84 * auVar128._4_4_;
      bVar84 = (bool)(bVar78 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar84 * auVar131._8_4_ | (uint)!bVar84 * auVar128._8_4_;
      bVar84 = (bool)(bVar78 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar84 * auVar131._12_4_ | (uint)!bVar84 * auVar128._12_4_;
      bVar84 = (bool)(bVar78 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar84 * auVar131._16_4_ | (uint)!bVar84 * auVar128._16_4_;
      bVar84 = (bool)(bVar78 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar84 * auVar131._20_4_ | (uint)!bVar84 * auVar128._20_4_;
      bVar84 = (bool)(bVar78 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar84 * auVar131._24_4_ | (uint)!bVar84 * auVar128._24_4_;
      auVar132._28_4_ =
           (uint)(bVar78 >> 7) * auVar131._28_4_ | (uint)!(bool)(bVar78 >> 7) * auVar128._28_4_;
      auVar102 = vmaxps_avx(auVar102,auVar132);
      uVar16 = vcmpps_avx512vl(auVar114,auVar129,6);
      bVar78 = (byte)uVar14 | (byte)uVar16;
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar133._0_4_ =
           (uint)(bVar78 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar113._0_4_;
      bVar84 = (bool)(bVar78 >> 1 & 1);
      auVar133._4_4_ = (uint)bVar84 * auVar114._4_4_ | (uint)!bVar84 * auVar113._4_4_;
      bVar84 = (bool)(bVar78 >> 2 & 1);
      auVar133._8_4_ = (uint)bVar84 * auVar114._8_4_ | (uint)!bVar84 * auVar113._8_4_;
      bVar84 = (bool)(bVar78 >> 3 & 1);
      auVar133._12_4_ = (uint)bVar84 * auVar114._12_4_ | (uint)!bVar84 * auVar113._12_4_;
      bVar84 = (bool)(bVar78 >> 4 & 1);
      auVar133._16_4_ = (uint)bVar84 * auVar114._16_4_ | (uint)!bVar84 * auVar113._16_4_;
      bVar84 = (bool)(bVar78 >> 5 & 1);
      auVar133._20_4_ = (uint)bVar84 * auVar114._20_4_ | (uint)!bVar84 * auVar113._20_4_;
      bVar84 = (bool)(bVar78 >> 6 & 1);
      auVar133._24_4_ = (uint)bVar84 * auVar114._24_4_ | (uint)!bVar84 * auVar113._24_4_;
      auVar133._28_4_ =
           (uint)(bVar78 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar78 >> 7) * auVar113._28_4_;
      auVar113 = vminps_avx(auVar123,auVar133);
      auVar266 = ZEXT864(0) << 0x20;
      auVar106 = vsubps_avx(ZEXT832(0) << 0x20,auVar106);
      auVar110 = vsubps_avx(ZEXT832(0) << 0x20,auVar110);
      auVar123 = ZEXT832(0) << 0x20;
      auVar99 = vsubps_avx(auVar123,auVar99);
      auVar51._4_4_ = auVar99._4_4_ * auVar98._4_4_;
      auVar51._0_4_ = auVar99._0_4_ * auVar98._0_4_;
      auVar51._8_4_ = auVar99._8_4_ * auVar98._8_4_;
      auVar51._12_4_ = auVar99._12_4_ * auVar98._12_4_;
      auVar51._16_4_ = auVar99._16_4_ * auVar98._16_4_;
      auVar51._20_4_ = auVar99._20_4_ * auVar98._20_4_;
      auVar51._24_4_ = auVar99._24_4_ * auVar98._24_4_;
      auVar51._28_4_ = auVar99._28_4_;
      auVar110 = vfnmsub231ps_avx512vl(auVar51,auVar97,auVar110);
      auVar106 = vfnmadd231ps_avx512vl(auVar110,auVar111,auVar106);
      auVar110 = vmulps_avx512vl(local_600,auVar98);
      auVar110 = vfnmsub231ps_avx512vl(auVar110,local_5e0,auVar97);
      auVar110 = vfnmadd231ps_avx512vl(auVar110,local_5c0,auVar111);
      vandps_avx512vl(auVar110,auVar115);
      uVar14 = vcmpps_avx512vl(auVar110,auVar124,1);
      auVar106 = vxorps_avx512vl(auVar106,auVar125);
      auVar99 = vrcp14ps_avx512vl(auVar110);
      auVar111 = vxorps_avx512vl(auVar110,auVar125);
      auVar259 = ZEXT3264(auVar111);
      auVar98 = vfnmadd213ps_avx512vl(auVar99,auVar110,auVar116);
      auVar90 = vfmadd132ps_fma(auVar98,auVar99,auVar99);
      auVar263 = ZEXT1664(auVar90);
      fVar250 = auVar90._0_4_ * auVar106._0_4_;
      fVar252 = auVar90._4_4_ * auVar106._4_4_;
      auVar52._4_4_ = fVar252;
      auVar52._0_4_ = fVar250;
      fVar253 = auVar90._8_4_ * auVar106._8_4_;
      auVar52._8_4_ = fVar253;
      fVar254 = auVar90._12_4_ * auVar106._12_4_;
      auVar52._12_4_ = fVar254;
      fVar245 = auVar106._16_4_ * 0.0;
      auVar52._16_4_ = fVar245;
      fVar246 = auVar106._20_4_ * 0.0;
      auVar52._20_4_ = fVar246;
      fVar255 = auVar106._24_4_ * 0.0;
      auVar52._24_4_ = fVar255;
      auVar52._28_4_ = auVar106._28_4_;
      uVar16 = vcmpps_avx512vl(auVar110,auVar111,1);
      bVar78 = (byte)uVar14 | (byte)uVar16;
      auVar98 = vblendmps_avx512vl(auVar52,auVar130);
      auVar134._0_4_ =
           (uint)(bVar78 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar99._0_4_;
      bVar84 = (bool)(bVar78 >> 1 & 1);
      auVar134._4_4_ = (uint)bVar84 * auVar98._4_4_ | (uint)!bVar84 * auVar99._4_4_;
      bVar84 = (bool)(bVar78 >> 2 & 1);
      auVar134._8_4_ = (uint)bVar84 * auVar98._8_4_ | (uint)!bVar84 * auVar99._8_4_;
      bVar84 = (bool)(bVar78 >> 3 & 1);
      auVar134._12_4_ = (uint)bVar84 * auVar98._12_4_ | (uint)!bVar84 * auVar99._12_4_;
      bVar84 = (bool)(bVar78 >> 4 & 1);
      auVar134._16_4_ = (uint)bVar84 * auVar98._16_4_ | (uint)!bVar84 * auVar99._16_4_;
      bVar84 = (bool)(bVar78 >> 5 & 1);
      auVar134._20_4_ = (uint)bVar84 * auVar98._20_4_ | (uint)!bVar84 * auVar99._20_4_;
      bVar84 = (bool)(bVar78 >> 6 & 1);
      auVar134._24_4_ = (uint)bVar84 * auVar98._24_4_ | (uint)!bVar84 * auVar99._24_4_;
      auVar134._28_4_ =
           (uint)(bVar78 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar78 >> 7) * auVar99._28_4_;
      auVar257 = ZEXT3264(auVar134);
      _local_760 = vmaxps_avx(auVar102,auVar134);
      uVar16 = vcmpps_avx512vl(auVar110,auVar111,6);
      bVar78 = (byte)uVar14 | (byte)uVar16;
      auVar135._0_4_ =
           (uint)(bVar78 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar78 & 1) * (int)fVar250;
      bVar84 = (bool)(bVar78 >> 1 & 1);
      auVar135._4_4_ = (uint)bVar84 * auVar114._4_4_ | (uint)!bVar84 * (int)fVar252;
      bVar84 = (bool)(bVar78 >> 2 & 1);
      auVar135._8_4_ = (uint)bVar84 * auVar114._8_4_ | (uint)!bVar84 * (int)fVar253;
      bVar84 = (bool)(bVar78 >> 3 & 1);
      auVar135._12_4_ = (uint)bVar84 * auVar114._12_4_ | (uint)!bVar84 * (int)fVar254;
      bVar84 = (bool)(bVar78 >> 4 & 1);
      auVar135._16_4_ = (uint)bVar84 * auVar114._16_4_ | (uint)!bVar84 * (int)fVar245;
      bVar84 = (bool)(bVar78 >> 5 & 1);
      auVar135._20_4_ = (uint)bVar84 * auVar114._20_4_ | (uint)!bVar84 * (int)fVar246;
      bVar84 = (bool)(bVar78 >> 6 & 1);
      auVar135._24_4_ = (uint)bVar84 * auVar114._24_4_ | (uint)!bVar84 * (int)fVar255;
      auVar135._28_4_ =
           (uint)(bVar78 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar78 >> 7) * auVar106._28_4_;
      auVar251 = ZEXT3264(auVar135);
      local_460 = vminps_avx(auVar113,auVar135);
      auVar249 = ZEXT3264(local_460);
      uVar14 = vcmpps_avx512vl(_local_760,local_460,2);
      bVar71 = bVar71 & 0x7f & (byte)uVar14;
      if (bVar71 == 0) {
        auVar230 = ZEXT3264(auVar116);
        auVar216 = ZEXT1664(auVar199);
      }
      else {
        auVar102 = vmaxps_avx(auVar123,auVar100);
        auVar106 = vminps_avx512vl(local_6c0,auVar116);
        auVar59 = ZEXT412(0);
        auVar257 = ZEXT1264(auVar59) << 0x20;
        auVar106 = vmaxps_avx(auVar106,ZEXT1232(auVar59) << 0x20);
        auVar110 = vminps_avx512vl(local_6e0,auVar116);
        auVar263 = ZEXT3264(CONCAT428(0x3e000000,
                                      CONCAT424(0x3e000000,
                                                CONCAT420(0x3e000000,
                                                          CONCAT416(0x3e000000,
                                                                    CONCAT412(0x3e000000,
                                                                              CONCAT48(0x3e000000,
                                                                                                                                                                              
                                                  0x3e0000003e000000)))))));
        auVar53._4_4_ = (auVar106._4_4_ + 1.0) * 0.125;
        auVar53._0_4_ = (auVar106._0_4_ + 0.0) * 0.125;
        auVar53._8_4_ = (auVar106._8_4_ + 2.0) * 0.125;
        auVar53._12_4_ = (auVar106._12_4_ + 3.0) * 0.125;
        auVar53._16_4_ = (auVar106._16_4_ + 4.0) * 0.125;
        auVar53._20_4_ = (auVar106._20_4_ + 5.0) * 0.125;
        auVar53._24_4_ = (auVar106._24_4_ + 6.0) * 0.125;
        auVar53._28_4_ = auVar106._28_4_ + 7.0;
        local_6c0 = vfmadd213ps_avx512vl(auVar53,local_8c0,auVar236);
        auVar106 = vmaxps_avx(auVar110,ZEXT1232(auVar59) << 0x20);
        auVar54._4_4_ = (auVar106._4_4_ + 1.0) * 0.125;
        auVar54._0_4_ = (auVar106._0_4_ + 0.0) * 0.125;
        auVar54._8_4_ = (auVar106._8_4_ + 2.0) * 0.125;
        auVar54._12_4_ = (auVar106._12_4_ + 3.0) * 0.125;
        auVar54._16_4_ = (auVar106._16_4_ + 4.0) * 0.125;
        auVar54._20_4_ = (auVar106._20_4_ + 5.0) * 0.125;
        auVar54._24_4_ = (auVar106._24_4_ + 6.0) * 0.125;
        auVar54._28_4_ = auVar106._28_4_ + 7.0;
        local_6e0 = vfmadd213ps_avx512vl(auVar54,local_8c0,auVar236);
        auVar55._4_4_ = auVar102._4_4_ * auVar102._4_4_;
        auVar55._0_4_ = auVar102._0_4_ * auVar102._0_4_;
        auVar55._8_4_ = auVar102._8_4_ * auVar102._8_4_;
        auVar55._12_4_ = auVar102._12_4_ * auVar102._12_4_;
        auVar55._16_4_ = auVar102._16_4_ * auVar102._16_4_;
        auVar55._20_4_ = auVar102._20_4_ * auVar102._20_4_;
        auVar55._24_4_ = auVar102._24_4_ * auVar102._24_4_;
        auVar55._28_4_ = local_6e0._28_4_;
        auVar102 = vsubps_avx(local_8e0,auVar55);
        auVar259 = ZEXT3264(auVar102);
        auVar106 = vmulps_avx512vl(auVar122,auVar102);
        auVar106 = vsubps_avx512vl(auVar118,auVar106);
        uVar14 = vcmpps_avx512vl(auVar106,ZEXT1232(auVar59) << 0x20,5);
        bVar78 = (byte)uVar14;
        if (bVar78 == 0) {
          auVar101 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar103 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar106 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar110 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar251 = ZEXT864(0) << 0x20;
          auVar136._8_4_ = 0x7f800000;
          auVar136._0_8_ = 0x7f8000007f800000;
          auVar136._12_4_ = 0x7f800000;
          auVar136._16_4_ = 0x7f800000;
          auVar136._20_4_ = 0x7f800000;
          auVar136._24_4_ = 0x7f800000;
          auVar136._28_4_ = 0x7f800000;
          auVar137._8_4_ = 0xff800000;
          auVar137._0_8_ = 0xff800000ff800000;
          auVar137._12_4_ = 0xff800000;
          auVar137._16_4_ = 0xff800000;
          auVar137._20_4_ = 0xff800000;
          auVar137._24_4_ = 0xff800000;
          auVar137._28_4_ = 0xff800000;
        }
        else {
          auVar88 = vxorps_avx512vl(auVar97._0_16_,auVar97._0_16_);
          uVar86 = vcmpps_avx512vl(auVar106,auVar123,5);
          auVar106 = vsqrtps_avx(auVar106);
          auVar239._0_4_ = auVar121._0_4_ + auVar121._0_4_;
          auVar239._4_4_ = auVar121._4_4_ + auVar121._4_4_;
          auVar239._8_4_ = auVar121._8_4_ + auVar121._8_4_;
          auVar239._12_4_ = auVar121._12_4_ + auVar121._12_4_;
          auVar239._16_4_ = auVar121._16_4_ + auVar121._16_4_;
          auVar239._20_4_ = auVar121._20_4_ + auVar121._20_4_;
          auVar239._24_4_ = auVar121._24_4_ + auVar121._24_4_;
          auVar239._28_4_ = auVar121._28_4_ + auVar121._28_4_;
          auVar110 = vrcp14ps_avx512vl(auVar239);
          auVar99 = vfnmadd213ps_avx512vl(auVar239,auVar110,auVar116);
          auVar90 = vfmadd132ps_fma(auVar99,auVar110,auVar110);
          auVar22._8_4_ = 0x80000000;
          auVar22._0_8_ = 0x8000000080000000;
          auVar22._12_4_ = 0x80000000;
          auVar22._16_4_ = 0x80000000;
          auVar22._20_4_ = 0x80000000;
          auVar22._24_4_ = 0x80000000;
          auVar22._28_4_ = 0x80000000;
          auVar110 = vxorps_avx512vl(auVar117,auVar22);
          auVar110 = vsubps_avx(auVar110,auVar106);
          auVar56._4_4_ = auVar110._4_4_ * auVar90._4_4_;
          auVar56._0_4_ = auVar110._0_4_ * auVar90._0_4_;
          auVar56._8_4_ = auVar110._8_4_ * auVar90._8_4_;
          auVar56._12_4_ = auVar110._12_4_ * auVar90._12_4_;
          auVar56._16_4_ = auVar110._16_4_ * 0.0;
          auVar56._20_4_ = auVar110._20_4_ * 0.0;
          auVar56._24_4_ = auVar110._24_4_ * 0.0;
          auVar56._28_4_ = 0x3e000000;
          auVar263 = ZEXT3264(auVar56);
          auVar106 = vsubps_avx512vl(auVar106,auVar117);
          auVar265._0_4_ = auVar106._0_4_ * auVar90._0_4_;
          auVar265._4_4_ = auVar106._4_4_ * auVar90._4_4_;
          auVar265._8_4_ = auVar106._8_4_ * auVar90._8_4_;
          auVar265._12_4_ = auVar106._12_4_ * auVar90._12_4_;
          auVar265._16_4_ = auVar106._16_4_ * 0.0;
          auVar265._20_4_ = auVar106._20_4_ * 0.0;
          auVar265._24_4_ = auVar106._24_4_ * 0.0;
          auVar265._28_4_ = 0;
          auVar266 = ZEXT3264(auVar265);
          auVar106 = vfmadd213ps_avx512vl(auVar119,auVar56,auVar112);
          auVar57._4_4_ = auVar101._4_4_ * auVar106._4_4_;
          auVar57._0_4_ = auVar101._0_4_ * auVar106._0_4_;
          auVar57._8_4_ = auVar101._8_4_ * auVar106._8_4_;
          auVar57._12_4_ = auVar101._12_4_ * auVar106._12_4_;
          auVar57._16_4_ = auVar101._16_4_ * auVar106._16_4_;
          auVar57._20_4_ = auVar101._20_4_ * auVar106._20_4_;
          auVar57._24_4_ = auVar101._24_4_ * auVar106._24_4_;
          auVar57._28_4_ = auVar110._28_4_;
          auVar106 = vmulps_avx512vl(local_5c0,auVar56);
          auVar110 = vmulps_avx512vl(local_5e0,auVar56);
          auVar99 = vmulps_avx512vl(local_600,auVar56);
          auVar100 = vfmadd213ps_avx512vl(auVar103,auVar57,auVar107);
          auVar106 = vsubps_avx512vl(auVar106,auVar100);
          auVar100 = vfmadd213ps_avx512vl(auVar104,auVar57,auVar108);
          auVar110 = vsubps_avx512vl(auVar110,auVar100);
          auVar90 = vfmadd213ps_fma(auVar57,auVar105,auVar109);
          auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar90));
          auVar251 = ZEXT3264(auVar99);
          auVar99 = vfmadd213ps_avx512vl(auVar119,auVar265,auVar112);
          auVar99 = vmulps_avx512vl(auVar101,auVar99);
          auVar101 = vmulps_avx512vl(local_5c0,auVar265);
          auVar100 = vmulps_avx512vl(local_5e0,auVar265);
          auVar111 = vmulps_avx512vl(local_600,auVar265);
          auVar90 = vfmadd213ps_fma(auVar103,auVar99,auVar107);
          auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar90));
          auVar257 = ZEXT3264(auVar101);
          auVar90 = vfmadd213ps_fma(auVar104,auVar99,auVar108);
          auVar101 = vsubps_avx512vl(auVar100,ZEXT1632(auVar90));
          auVar90 = vfmadd213ps_fma(auVar105,auVar99,auVar109);
          auVar103 = vsubps_avx512vl(auVar111,ZEXT1632(auVar90));
          auVar165._8_4_ = 0x7f800000;
          auVar165._0_8_ = 0x7f8000007f800000;
          auVar165._12_4_ = 0x7f800000;
          auVar165._16_4_ = 0x7f800000;
          auVar165._20_4_ = 0x7f800000;
          auVar165._24_4_ = 0x7f800000;
          auVar165._28_4_ = 0x7f800000;
          auVar104 = vblendmps_avx512vl(auVar165,auVar56);
          bVar84 = (bool)((byte)uVar86 & 1);
          auVar136._0_4_ = (uint)bVar84 * auVar104._0_4_ | (uint)!bVar84 * auVar107._0_4_;
          bVar84 = (bool)((byte)(uVar86 >> 1) & 1);
          auVar136._4_4_ = (uint)bVar84 * auVar104._4_4_ | (uint)!bVar84 * auVar107._4_4_;
          bVar84 = (bool)((byte)(uVar86 >> 2) & 1);
          auVar136._8_4_ = (uint)bVar84 * auVar104._8_4_ | (uint)!bVar84 * auVar107._8_4_;
          bVar84 = (bool)((byte)(uVar86 >> 3) & 1);
          auVar136._12_4_ = (uint)bVar84 * auVar104._12_4_ | (uint)!bVar84 * auVar107._12_4_;
          bVar84 = (bool)((byte)(uVar86 >> 4) & 1);
          auVar136._16_4_ = (uint)bVar84 * auVar104._16_4_ | (uint)!bVar84 * auVar107._16_4_;
          bVar84 = (bool)((byte)(uVar86 >> 5) & 1);
          auVar136._20_4_ = (uint)bVar84 * auVar104._20_4_ | (uint)!bVar84 * auVar107._20_4_;
          bVar84 = (bool)((byte)(uVar86 >> 6) & 1);
          auVar136._24_4_ = (uint)bVar84 * auVar104._24_4_ | (uint)!bVar84 * auVar107._24_4_;
          bVar84 = SUB81(uVar86 >> 7,0);
          auVar136._28_4_ = (uint)bVar84 * auVar104._28_4_ | (uint)!bVar84 * auVar107._28_4_;
          auVar166._8_4_ = 0xff800000;
          auVar166._0_8_ = 0xff800000ff800000;
          auVar166._12_4_ = 0xff800000;
          auVar166._16_4_ = 0xff800000;
          auVar166._20_4_ = 0xff800000;
          auVar166._24_4_ = 0xff800000;
          auVar166._28_4_ = 0xff800000;
          auVar104 = vblendmps_avx512vl(auVar166,auVar265);
          bVar84 = (bool)((byte)uVar86 & 1);
          auVar137._0_4_ = (uint)bVar84 * auVar104._0_4_ | (uint)!bVar84 * -0x800000;
          bVar84 = (bool)((byte)(uVar86 >> 1) & 1);
          auVar137._4_4_ = (uint)bVar84 * auVar104._4_4_ | (uint)!bVar84 * -0x800000;
          bVar84 = (bool)((byte)(uVar86 >> 2) & 1);
          auVar137._8_4_ = (uint)bVar84 * auVar104._8_4_ | (uint)!bVar84 * -0x800000;
          bVar84 = (bool)((byte)(uVar86 >> 3) & 1);
          auVar137._12_4_ = (uint)bVar84 * auVar104._12_4_ | (uint)!bVar84 * -0x800000;
          bVar84 = (bool)((byte)(uVar86 >> 4) & 1);
          auVar137._16_4_ = (uint)bVar84 * auVar104._16_4_ | (uint)!bVar84 * -0x800000;
          bVar84 = (bool)((byte)(uVar86 >> 5) & 1);
          auVar137._20_4_ = (uint)bVar84 * auVar104._20_4_ | (uint)!bVar84 * -0x800000;
          bVar84 = (bool)((byte)(uVar86 >> 6) & 1);
          auVar137._24_4_ = (uint)bVar84 * auVar104._24_4_ | (uint)!bVar84 * -0x800000;
          bVar84 = SUB81(uVar86 >> 7,0);
          auVar137._28_4_ = (uint)bVar84 * auVar104._28_4_ | (uint)!bVar84 * -0x800000;
          vandps_avx512vl(auVar115,auVar120);
          auVar104 = vmaxps_avx(local_620,auVar137);
          auVar23._8_4_ = 0x36000000;
          auVar23._0_8_ = 0x3600000036000000;
          auVar23._12_4_ = 0x36000000;
          auVar23._16_4_ = 0x36000000;
          auVar23._20_4_ = 0x36000000;
          auVar23._24_4_ = 0x36000000;
          auVar23._28_4_ = 0x36000000;
          auVar104 = vmulps_avx512vl(auVar104,auVar23);
          vandps_avx512vl(auVar121,auVar115);
          uVar76 = vcmpps_avx512vl(auVar104,auVar104,1);
          uVar86 = uVar86 & uVar76;
          bVar73 = (byte)uVar86;
          if (bVar73 != 0) {
            uVar76 = vcmpps_avx512vl(auVar102,ZEXT1632(auVar88),2);
            auVar248._8_4_ = 0xff800000;
            auVar248._0_8_ = 0xff800000ff800000;
            auVar248._12_4_ = 0xff800000;
            auVar248._16_4_ = 0xff800000;
            auVar248._20_4_ = 0xff800000;
            auVar248._24_4_ = 0xff800000;
            auVar248._28_4_ = 0xff800000;
            auVar258._8_4_ = 0x7f800000;
            auVar258._0_8_ = 0x7f8000007f800000;
            auVar258._12_4_ = 0x7f800000;
            auVar258._16_4_ = 0x7f800000;
            auVar258._20_4_ = 0x7f800000;
            auVar258._24_4_ = 0x7f800000;
            auVar258._28_4_ = 0x7f800000;
            auVar259 = ZEXT3264(auVar258);
            auVar102 = vblendmps_avx512vl(auVar258,auVar248);
            bVar77 = (byte)uVar76;
            uVar87 = (uint)(bVar77 & 1) * auVar102._0_4_ |
                     (uint)!(bool)(bVar77 & 1) * auVar104._0_4_;
            bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
            uVar147 = (uint)bVar84 * auVar102._4_4_ | (uint)!bVar84 * auVar104._4_4_;
            bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
            uVar148 = (uint)bVar84 * auVar102._8_4_ | (uint)!bVar84 * auVar104._8_4_;
            bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
            uVar149 = (uint)bVar84 * auVar102._12_4_ | (uint)!bVar84 * auVar104._12_4_;
            bVar84 = (bool)((byte)(uVar76 >> 4) & 1);
            uVar150 = (uint)bVar84 * auVar102._16_4_ | (uint)!bVar84 * auVar104._16_4_;
            bVar84 = (bool)((byte)(uVar76 >> 5) & 1);
            uVar151 = (uint)bVar84 * auVar102._20_4_ | (uint)!bVar84 * auVar104._20_4_;
            bVar84 = (bool)((byte)(uVar76 >> 6) & 1);
            uVar152 = (uint)bVar84 * auVar102._24_4_ | (uint)!bVar84 * auVar104._24_4_;
            bVar84 = SUB81(uVar76 >> 7,0);
            uVar153 = (uint)bVar84 * auVar102._28_4_ | (uint)!bVar84 * auVar104._28_4_;
            auVar136._0_4_ = (bVar73 & 1) * uVar87 | !(bool)(bVar73 & 1) * auVar136._0_4_;
            bVar84 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar136._4_4_ = bVar84 * uVar147 | !bVar84 * auVar136._4_4_;
            bVar84 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar136._8_4_ = bVar84 * uVar148 | !bVar84 * auVar136._8_4_;
            bVar84 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar136._12_4_ = bVar84 * uVar149 | !bVar84 * auVar136._12_4_;
            bVar84 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar136._16_4_ = bVar84 * uVar150 | !bVar84 * auVar136._16_4_;
            bVar84 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar136._20_4_ = bVar84 * uVar151 | !bVar84 * auVar136._20_4_;
            bVar84 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar136._24_4_ = bVar84 * uVar152 | !bVar84 * auVar136._24_4_;
            bVar84 = SUB81(uVar86 >> 7,0);
            auVar136._28_4_ = bVar84 * uVar153 | !bVar84 * auVar136._28_4_;
            auVar102 = vblendmps_avx512vl(auVar248,auVar258);
            bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar76 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar76 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar76 >> 6) & 1);
            bVar11 = SUB81(uVar76 >> 7,0);
            auVar137._0_4_ =
                 (uint)(bVar73 & 1) *
                 ((uint)(bVar77 & 1) * auVar102._0_4_ | !(bool)(bVar77 & 1) * uVar87) |
                 !(bool)(bVar73 & 1) * auVar137._0_4_;
            bVar5 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar137._4_4_ =
                 (uint)bVar5 * ((uint)bVar84 * auVar102._4_4_ | !bVar84 * uVar147) |
                 !bVar5 * auVar137._4_4_;
            bVar84 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar137._8_4_ =
                 (uint)bVar84 * ((uint)bVar6 * auVar102._8_4_ | !bVar6 * uVar148) |
                 !bVar84 * auVar137._8_4_;
            bVar84 = (bool)((byte)(uVar86 >> 3) & 1);
            auVar137._12_4_ =
                 (uint)bVar84 * ((uint)bVar7 * auVar102._12_4_ | !bVar7 * uVar149) |
                 !bVar84 * auVar137._12_4_;
            bVar84 = (bool)((byte)(uVar86 >> 4) & 1);
            auVar137._16_4_ =
                 (uint)bVar84 * ((uint)bVar8 * auVar102._16_4_ | !bVar8 * uVar150) |
                 !bVar84 * auVar137._16_4_;
            bVar84 = (bool)((byte)(uVar86 >> 5) & 1);
            auVar137._20_4_ =
                 (uint)bVar84 * ((uint)bVar9 * auVar102._20_4_ | !bVar9 * uVar151) |
                 !bVar84 * auVar137._20_4_;
            bVar84 = (bool)((byte)(uVar86 >> 6) & 1);
            auVar137._24_4_ =
                 (uint)bVar84 * ((uint)bVar10 * auVar102._24_4_ | !bVar10 * uVar152) |
                 !bVar84 * auVar137._24_4_;
            bVar84 = SUB81(uVar86 >> 7,0);
            auVar137._28_4_ =
                 (uint)bVar84 * ((uint)bVar11 * auVar102._28_4_ | !bVar11 * uVar153) |
                 !bVar84 * auVar137._28_4_;
            bVar78 = (~bVar73 | bVar77) & bVar78;
          }
        }
        auVar102 = vmulps_avx512vl(local_600,auVar103);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_5e0,auVar101);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_5c0,auVar257._0_32_);
        _local_1c0 = _local_760;
        local_1a0 = vminps_avx(local_460,auVar136);
        vandps_avx512vl(auVar102,auVar115);
        _local_720 = vmaxps_avx(_local_760,auVar137);
        auVar243 = ZEXT3264(_local_720);
        _local_480 = _local_720;
        auVar167._8_4_ = 0x3e99999a;
        auVar167._0_8_ = 0x3e99999a3e99999a;
        auVar167._12_4_ = 0x3e99999a;
        auVar167._16_4_ = 0x3e99999a;
        auVar167._20_4_ = 0x3e99999a;
        auVar167._24_4_ = 0x3e99999a;
        auVar167._28_4_ = 0x3e99999a;
        uVar14 = vcmpps_avx512vl(auVar102,auVar167,1);
        uVar16 = vcmpps_avx512vl(_local_760,local_1a0,2);
        bVar73 = (byte)uVar16 & bVar71;
        uVar15 = vcmpps_avx512vl(_local_720,local_460,2);
        if ((bVar71 & ((byte)uVar15 | (byte)uVar16)) == 0) {
          auVar230 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          auVar216 = ZEXT1664(auVar199);
        }
        else {
          auVar102 = vmulps_avx512vl(local_600,auVar251._0_32_);
          auVar102 = vfmadd213ps_avx512vl(auVar110,local_5e0,auVar102);
          auVar102 = vfmadd213ps_avx512vl(auVar106,local_5c0,auVar102);
          vandps_avx512vl(auVar102,auVar115);
          uVar16 = vcmpps_avx512vl(auVar102,auVar167,1);
          bVar77 = (byte)uVar16 | ~bVar78;
          auVar168._8_4_ = 2;
          auVar168._0_8_ = 0x200000002;
          auVar168._12_4_ = 2;
          auVar168._16_4_ = 2;
          auVar168._20_4_ = 2;
          auVar168._24_4_ = 2;
          auVar168._28_4_ = 2;
          auVar24._8_4_ = 3;
          auVar24._0_8_ = 0x300000003;
          auVar24._12_4_ = 3;
          auVar24._16_4_ = 3;
          auVar24._20_4_ = 3;
          auVar24._24_4_ = 3;
          auVar24._28_4_ = 3;
          auVar102 = vpblendmd_avx512vl(auVar168,auVar24);
          local_440._0_4_ = (uint)(bVar77 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar77 & 1) * 2;
          bVar84 = (bool)(bVar77 >> 1 & 1);
          local_440._4_4_ = (uint)bVar84 * auVar102._4_4_ | (uint)!bVar84 * 2;
          bVar84 = (bool)(bVar77 >> 2 & 1);
          local_440._8_4_ = (uint)bVar84 * auVar102._8_4_ | (uint)!bVar84 * 2;
          bVar84 = (bool)(bVar77 >> 3 & 1);
          local_440._12_4_ = (uint)bVar84 * auVar102._12_4_ | (uint)!bVar84 * 2;
          bVar84 = (bool)(bVar77 >> 4 & 1);
          local_440._16_4_ = (uint)bVar84 * auVar102._16_4_ | (uint)!bVar84 * 2;
          bVar84 = (bool)(bVar77 >> 5 & 1);
          local_440._20_4_ = (uint)bVar84 * auVar102._20_4_ | (uint)!bVar84 * 2;
          bVar84 = (bool)(bVar77 >> 6 & 1);
          local_440._24_4_ = (uint)bVar84 * auVar102._24_4_ | (uint)!bVar84 * 2;
          local_440._28_4_ = (uint)(bVar77 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar77 >> 7) * 2;
          local_640 = vpbroadcastd_avx512vl();
          uVar16 = vpcmpd_avx512vl(local_640,local_440,5);
          bVar77 = (byte)uVar16 & bVar73;
          if (bVar77 == 0) {
            auVar233._8_4_ = 0x7fffffff;
            auVar233._0_8_ = 0x7fffffff7fffffff;
            auVar233._12_4_ = 0x7fffffff;
          }
          else {
            auVar88 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar90 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar1 = vminps_avx(local_840._0_16_,local_880._0_16_);
            auVar91 = vminps_avx(auVar88,auVar1);
            auVar88 = vmaxps_avx(local_840._0_16_,local_880._0_16_);
            auVar1 = vmaxps_avx(auVar90,auVar88);
            auVar200._8_4_ = 0x7fffffff;
            auVar200._0_8_ = 0x7fffffff7fffffff;
            auVar200._12_4_ = 0x7fffffff;
            auVar90 = vandps_avx(auVar91,auVar200);
            auVar88 = vandps_avx(auVar1,auVar200);
            auVar90 = vmaxps_avx(auVar90,auVar88);
            auVar88 = vmovshdup_avx(auVar90);
            auVar88 = vmaxss_avx(auVar88,auVar90);
            auVar90 = vshufpd_avx(auVar90,auVar90,1);
            auVar90 = vmaxss_avx(auVar90,auVar88);
            fVar250 = auVar90._0_4_ * 1.9073486e-06;
            local_7e0 = vshufps_avx(auVar1,auVar1,0xff);
            local_700 = (float)local_760._0_4_ + (float)local_740._0_4_;
            fStack_6fc = (float)local_760._4_4_ + (float)local_740._4_4_;
            fStack_6f8 = fStack_758 + fStack_738;
            fStack_6f4 = fStack_754 + fStack_734;
            fStack_6f0 = fStack_750 + fStack_730;
            fStack_6ec = fStack_74c + fStack_72c;
            fStack_6e8 = fStack_748 + fStack_728;
            fStack_6e4 = fStack_744 + fStack_724;
            do {
              auVar169._8_4_ = 0x7f800000;
              auVar169._0_8_ = 0x7f8000007f800000;
              auVar169._12_4_ = 0x7f800000;
              auVar169._16_4_ = 0x7f800000;
              auVar169._20_4_ = 0x7f800000;
              auVar169._24_4_ = 0x7f800000;
              auVar169._28_4_ = 0x7f800000;
              auVar102 = vblendmps_avx512vl(auVar169,_local_760);
              auVar138._0_4_ =
                   (uint)(bVar77 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar77 & 1) * 0x7f800000;
              bVar84 = (bool)(bVar77 >> 1 & 1);
              auVar138._4_4_ = (uint)bVar84 * auVar102._4_4_ | (uint)!bVar84 * 0x7f800000;
              bVar84 = (bool)(bVar77 >> 2 & 1);
              auVar138._8_4_ = (uint)bVar84 * auVar102._8_4_ | (uint)!bVar84 * 0x7f800000;
              bVar84 = (bool)(bVar77 >> 3 & 1);
              auVar138._12_4_ = (uint)bVar84 * auVar102._12_4_ | (uint)!bVar84 * 0x7f800000;
              bVar84 = (bool)(bVar77 >> 4 & 1);
              auVar138._16_4_ = (uint)bVar84 * auVar102._16_4_ | (uint)!bVar84 * 0x7f800000;
              bVar84 = (bool)(bVar77 >> 5 & 1);
              auVar138._20_4_ = (uint)bVar84 * auVar102._20_4_ | (uint)!bVar84 * 0x7f800000;
              auVar138._24_4_ =
                   (uint)(bVar77 >> 6) * auVar102._24_4_ | (uint)!(bool)(bVar77 >> 6) * 0x7f800000;
              auVar138._28_4_ = 0x7f800000;
              auVar102 = vshufps_avx(auVar138,auVar138,0xb1);
              auVar102 = vminps_avx(auVar138,auVar102);
              auVar101 = vshufpd_avx(auVar102,auVar102,5);
              auVar102 = vminps_avx(auVar102,auVar101);
              auVar101 = vpermpd_avx2(auVar102,0x4e);
              auVar102 = vminps_avx(auVar102,auVar101);
              uVar16 = vcmpps_avx512vl(auVar138,auVar102,0);
              bVar72 = (byte)uVar16 & bVar77;
              bVar79 = bVar77;
              if (bVar72 != 0) {
                bVar79 = bVar72;
              }
              iVar17 = 0;
              for (uVar87 = (uint)bVar79; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              bVar79 = '\x01' << ((byte)iVar17 & 0x1f);
              uVar87 = *(uint *)(local_6c0 + (uint)(iVar17 << 2));
              uVar147 = *(uint *)(local_1c0 + (uint)(iVar17 << 2));
              fVar252 = auVar13._0_4_;
              if ((float)local_8a0._0_4_ < 0.0) {
                fVar252 = sqrtf((float)local_8a0._0_4_);
              }
              auVar257 = ZEXT464(uVar87);
              auVar249 = ZEXT464(uVar147);
              bVar72 = ~bVar79;
              lVar83 = 5;
              do {
                fVar253 = auVar249._0_4_;
                auVar157._4_4_ = fVar253;
                auVar157._0_4_ = fVar253;
                auVar157._8_4_ = fVar253;
                auVar157._12_4_ = fVar253;
                auVar90 = vfmadd132ps_fma(auVar157,ZEXT816(0) << 0x40,local_890);
                fVar256 = auVar257._0_4_;
                fVar241 = 1.0 - fVar256;
                fVar245 = fVar241 * fVar241 * fVar241;
                fVar220 = fVar256 * fVar256 * fVar256;
                auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar245),
                                          ZEXT416((uint)fVar220));
                fVar254 = fVar256 * fVar241;
                auVar231 = ZEXT416((uint)fVar241);
                auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar256 * fVar254 * 6.0)),
                                          ZEXT416((uint)(fVar254 * fVar241)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar220),
                                         ZEXT416((uint)fVar245));
                auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * fVar241 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar256 * fVar254)));
                fVar245 = fVar245 * 0.16666667;
                fVar246 = (auVar88._0_4_ + auVar91._0_4_) * 0.16666667;
                fVar255 = (auVar1._0_4_ + auVar89._0_4_) * 0.16666667;
                fVar220 = fVar220 * 0.16666667;
                auVar201._0_4_ = fVar220 * (float)local_880._0_4_;
                auVar201._4_4_ = fVar220 * (float)local_880._4_4_;
                auVar201._8_4_ = fVar220 * fStack_878;
                auVar201._12_4_ = fVar220 * fStack_874;
                auVar232._4_4_ = fVar255;
                auVar232._0_4_ = fVar255;
                auVar232._8_4_ = fVar255;
                auVar232._12_4_ = fVar255;
                auVar88 = vfmadd132ps_fma(auVar232,auVar201,local_840._0_16_);
                auVar202._4_4_ = fVar246;
                auVar202._0_4_ = fVar246;
                auVar202._8_4_ = fVar246;
                auVar202._12_4_ = fVar246;
                auVar88 = vfmadd132ps_fma(auVar202,auVar88,local_860._0_16_);
                auVar180._4_4_ = fVar245;
                auVar180._0_4_ = fVar245;
                auVar180._8_4_ = fVar245;
                auVar180._12_4_ = fVar245;
                local_770 = vfmadd132ps_fma(auVar180,auVar88,local_820._0_16_);
                auVar90 = vsubps_avx(auVar90,local_770);
                local_8c0._0_16_ = auVar90;
                auVar90 = vdpps_avx(auVar90,auVar90,0x7f);
                auVar88 = auVar257._0_16_;
                local_8e0._0_16_ = auVar90;
                if (auVar90._0_4_ < 0.0) {
                  auVar216._0_4_ = sqrtf(auVar90._0_4_);
                  auVar216._4_60_ = extraout_var;
                  auVar90 = auVar216._0_16_;
                }
                else {
                  auVar90 = vsqrtss_avx(auVar90,auVar90);
                }
                auVar91 = vfnmsub213ss_fma(auVar88,auVar88,ZEXT416((uint)(fVar254 * 4.0)));
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * 4.0)),auVar231,auVar231);
                fVar254 = fVar241 * -fVar241 * 0.5;
                fVar245 = auVar91._0_4_ * 0.5;
                fVar246 = auVar1._0_4_ * 0.5;
                fVar255 = fVar256 * fVar256 * 0.5;
                auVar221._0_4_ = fVar255 * (float)local_880._0_4_;
                auVar221._4_4_ = fVar255 * (float)local_880._4_4_;
                auVar221._8_4_ = fVar255 * fStack_878;
                auVar221._12_4_ = fVar255 * fStack_874;
                auVar181._4_4_ = fVar246;
                auVar181._0_4_ = fVar246;
                auVar181._8_4_ = fVar246;
                auVar181._12_4_ = fVar246;
                auVar1 = vfmadd132ps_fma(auVar181,auVar221,local_840._0_16_);
                auVar203._4_4_ = fVar245;
                auVar203._0_4_ = fVar245;
                auVar203._8_4_ = fVar245;
                auVar203._12_4_ = fVar245;
                auVar1 = vfmadd132ps_fma(auVar203,auVar1,local_860._0_16_);
                auVar261._4_4_ = fVar254;
                auVar261._0_4_ = fVar254;
                auVar261._8_4_ = fVar254;
                auVar261._12_4_ = fVar254;
                auVar1 = vfmadd132ps_fma(auVar261,auVar1,local_820._0_16_);
                local_790 = vdpps_avx(auVar1,auVar1,0x7f);
                auVar60._12_4_ = 0;
                auVar60._0_12_ = ZEXT812(0);
                fVar254 = local_790._0_4_;
                auVar91 = vrsqrt14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar254));
                fVar245 = auVar91._0_4_;
                local_7a0 = vrcp14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar254));
                auVar91 = vfnmadd213ss_fma(local_7a0,local_790,ZEXT416(0x40000000));
                uVar87 = auVar90._0_4_;
                local_780 = fVar241;
                fStack_77c = fVar241;
                fStack_778 = fVar241;
                fStack_774 = fVar241;
                if (fVar254 < -fVar254) {
                  fVar246 = sqrtf(fVar254);
                  auVar90 = ZEXT416(uVar87);
                }
                else {
                  auVar89 = vsqrtss_avx(local_790,local_790);
                  fVar246 = auVar89._0_4_;
                }
                fVar254 = fVar245 * 1.5 + fVar254 * -0.5 * fVar245 * fVar245 * fVar245;
                auVar158._0_4_ = auVar1._0_4_ * fVar254;
                auVar158._4_4_ = auVar1._4_4_ * fVar254;
                auVar158._8_4_ = auVar1._8_4_ * fVar254;
                auVar158._12_4_ = auVar1._12_4_ * fVar254;
                auVar89 = vdpps_avx(local_8c0._0_16_,auVar158,0x7f);
                fVar220 = auVar90._0_4_;
                fVar245 = auVar89._0_4_;
                auVar159._0_4_ = fVar245 * fVar245;
                auVar159._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                auVar159._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                auVar159._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                auVar92 = vsubps_avx512vl(local_8e0._0_16_,auVar159);
                fVar255 = auVar92._0_4_;
                auVar182._4_12_ = ZEXT812(0) << 0x20;
                auVar182._0_4_ = fVar255;
                auVar93 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar182);
                auVar94 = vmulss_avx512f(auVar93,ZEXT416(0x3fc00000));
                auVar95 = vmulss_avx512f(auVar92,ZEXT416(0xbf000000));
                if (fVar255 < 0.0) {
                  local_7c0 = fVar254;
                  fStack_7bc = fVar254;
                  fStack_7b8 = fVar254;
                  fStack_7b4 = fVar254;
                  local_7b0 = auVar93;
                  fVar255 = sqrtf(fVar255);
                  auVar95 = ZEXT416(auVar95._0_4_);
                  auVar94 = ZEXT416(auVar94._0_4_);
                  auVar90 = ZEXT416(uVar87);
                  auVar93 = local_7b0;
                  fVar254 = local_7c0;
                  fVar241 = fStack_7bc;
                  fVar242 = fStack_7b8;
                  fVar247 = fStack_7b4;
                }
                else {
                  auVar92 = vsqrtss_avx(auVar92,auVar92);
                  fVar255 = auVar92._0_4_;
                  fVar241 = fVar254;
                  fVar242 = fVar254;
                  fVar247 = fVar254;
                }
                auVar263 = ZEXT1664(auVar1);
                auVar251 = ZEXT1664(local_8c0._0_16_);
                auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar268 = ZEXT3264(auVar102);
                auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar231,auVar88);
                auVar88 = vfmadd231ss_fma(auVar231,auVar88,SUB6416(ZEXT464(0xc0000000),0));
                auVar204._0_4_ = fVar256 * (float)local_880._0_4_;
                auVar204._4_4_ = fVar256 * (float)local_880._4_4_;
                auVar204._8_4_ = fVar256 * fStack_878;
                auVar204._12_4_ = fVar256 * fStack_874;
                auVar222._0_4_ = auVar88._0_4_;
                auVar222._4_4_ = auVar222._0_4_;
                auVar222._8_4_ = auVar222._0_4_;
                auVar222._12_4_ = auVar222._0_4_;
                auVar88 = vfmadd132ps_fma(auVar222,auVar204,local_840._0_16_);
                auVar183._0_4_ = auVar92._0_4_;
                auVar183._4_4_ = auVar183._0_4_;
                auVar183._8_4_ = auVar183._0_4_;
                auVar183._12_4_ = auVar183._0_4_;
                auVar88 = vfmadd132ps_fma(auVar183,auVar88,local_860._0_16_);
                auVar66._4_4_ = fStack_77c;
                auVar66._0_4_ = local_780;
                auVar66._8_4_ = fStack_778;
                auVar66._12_4_ = fStack_774;
                auVar88 = vfmadd132ps_fma(auVar66,auVar88,local_820._0_16_);
                auVar184._0_4_ = auVar88._0_4_ * (float)local_790._0_4_;
                auVar184._4_4_ = auVar88._4_4_ * (float)local_790._0_4_;
                auVar184._8_4_ = auVar88._8_4_ * (float)local_790._0_4_;
                auVar184._12_4_ = auVar88._12_4_ * (float)local_790._0_4_;
                auVar88 = vdpps_avx(auVar1,auVar88,0x7f);
                fVar260 = auVar88._0_4_;
                auVar205._0_4_ = auVar1._0_4_ * fVar260;
                auVar205._4_4_ = auVar1._4_4_ * fVar260;
                auVar205._8_4_ = auVar1._8_4_ * fVar260;
                auVar205._12_4_ = auVar1._12_4_ * fVar260;
                auVar88 = vsubps_avx(auVar184,auVar205);
                fVar260 = auVar91._0_4_ * (float)local_7a0._0_4_;
                auVar231 = vmaxss_avx(ZEXT416((uint)fVar250),
                                      ZEXT416((uint)(fVar253 * fVar252 * 1.9073486e-06)));
                auVar18._8_4_ = 0x80000000;
                auVar18._0_8_ = 0x8000000080000000;
                auVar18._12_4_ = 0x80000000;
                auVar140._16_16_ = auVar102._16_16_;
                auVar96 = vxorps_avx512vl(auVar1,auVar18);
                auVar206._0_4_ = fVar254 * auVar88._0_4_ * fVar260;
                auVar206._4_4_ = fVar241 * auVar88._4_4_ * fVar260;
                auVar206._8_4_ = fVar242 * auVar88._8_4_ * fVar260;
                auVar206._12_4_ = fVar247 * auVar88._12_4_ * fVar260;
                auVar259 = ZEXT1664(auVar158);
                auVar88 = vdpps_avx(auVar96,auVar158,0x7f);
                auVar91 = vfmadd213ss_fma(auVar90,ZEXT416((uint)fVar250),auVar231);
                auVar90 = vdpps_avx(local_8c0._0_16_,auVar206,0x7f);
                auVar92 = vfmadd213ss_fma(ZEXT416((uint)(fVar220 + 1.0)),
                                          ZEXT416((uint)(fVar250 / fVar246)),auVar91);
                auVar266 = ZEXT1664(auVar92);
                fVar254 = auVar88._0_4_ + auVar90._0_4_;
                auVar90 = vdpps_avx(local_890,auVar158,0x7f);
                auVar88 = vdpps_avx(local_8c0._0_16_,auVar96,0x7f);
                auVar91 = vmulss_avx512f(auVar95,auVar93);
                auVar95 = vaddss_avx512f(auVar94,ZEXT416((uint)(auVar91._0_4_ *
                                                               auVar93._0_4_ * auVar93._0_4_)));
                auVar91 = vdpps_avx(local_8c0._0_16_,local_890,0x7f);
                auVar93 = vfnmadd231ss_fma(auVar88,auVar89,ZEXT416((uint)fVar254));
                auVar94 = vfnmadd231ss_fma(auVar91,auVar89,auVar90);
                auVar88 = vpermilps_avx(local_770,0xff);
                fVar255 = fVar255 - auVar88._0_4_;
                auVar88 = vshufps_avx(auVar1,auVar1,0xff);
                auVar91 = vfmsub213ss_fma(auVar93,auVar95,auVar88);
                fVar246 = auVar94._0_4_ * auVar95._0_4_;
                auVar93 = vfmsub231ss_fma(ZEXT416((uint)(auVar90._0_4_ * auVar91._0_4_)),
                                          ZEXT416((uint)fVar254),ZEXT416((uint)fVar246));
                fVar220 = auVar93._0_4_;
                fVar246 = fVar245 * (fVar246 / fVar220) - fVar255 * (auVar90._0_4_ / fVar220);
                auVar243 = ZEXT464((uint)fVar246);
                fVar256 = fVar256 - fVar246;
                auVar257 = ZEXT464((uint)fVar256);
                fVar253 = fVar253 - (fVar255 * (fVar254 / fVar220) -
                                    fVar245 * (auVar91._0_4_ / fVar220));
                auVar249 = ZEXT464((uint)fVar253);
                auVar233._8_4_ = 0x7fffffff;
                auVar233._0_8_ = 0x7fffffff7fffffff;
                auVar233._12_4_ = 0x7fffffff;
                auVar90 = vandps_avx(auVar89,auVar233);
                bVar84 = true;
                if (auVar90._0_4_ < auVar92._0_4_) {
                  auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar92._0_4_ + auVar231._0_4_)),
                                            local_7e0,ZEXT416(0x36000000));
                  auVar90 = vandps_avx(ZEXT416((uint)fVar255),auVar233);
                  if (auVar90._0_4_ < auVar91._0_4_) {
                    fVar253 = fVar253 + (float)local_7d0._0_4_;
                    auVar249 = ZEXT464((uint)fVar253);
                    if (fVar154 <= fVar253) {
                      fVar254 = *(float *)(ray + k * 4 + 0x100);
                      auVar243 = ZEXT464((uint)fVar254);
                      if (((fVar253 <= fVar254) && (0.0 <= fVar256)) && (fVar256 <= 1.0)) {
                        auVar140._0_16_ = ZEXT816(0) << 0x20;
                        auVar139._4_28_ = auVar140._4_28_;
                        auVar139._0_4_ = local_8e0._0_4_;
                        auVar90 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar139._0_16_);
                        fVar245 = auVar90._0_4_;
                        auVar90 = vmulss_avx512f(local_8e0._0_16_,ZEXT416(0xbf000000));
                        pGVar3 = (context->scene->geometries).items[uVar80].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                            bVar79 = true;
                          }
                          else {
                            fVar245 = fVar245 * 1.5 + auVar90._0_4_ * fVar245 * fVar245 * fVar245;
                            auVar185._0_4_ = local_8c0._0_4_ * fVar245;
                            auVar185._4_4_ = local_8c0._4_4_ * fVar245;
                            auVar185._8_4_ = local_8c0._8_4_ * fVar245;
                            auVar185._12_4_ = local_8c0._12_4_ * fVar245;
                            auVar89 = vfmadd213ps_fma(auVar88,auVar185,auVar1);
                            auVar90 = vshufps_avx(auVar185,auVar185,0xc9);
                            auVar88 = vshufps_avx(auVar1,auVar1,0xc9);
                            auVar186._0_4_ = auVar185._0_4_ * auVar88._0_4_;
                            auVar186._4_4_ = auVar185._4_4_ * auVar88._4_4_;
                            auVar186._8_4_ = auVar185._8_4_ * auVar88._8_4_;
                            auVar186._12_4_ = auVar185._12_4_ * auVar88._12_4_;
                            auVar91 = vfmsub231ps_fma(auVar186,auVar1,auVar90);
                            auVar90 = vshufps_avx(auVar91,auVar91,0xc9);
                            auVar88 = vshufps_avx(auVar89,auVar89,0xc9);
                            auVar91 = vshufps_avx(auVar91,auVar91,0xd2);
                            auVar160._0_4_ = auVar89._0_4_ * auVar91._0_4_;
                            auVar160._4_4_ = auVar89._4_4_ * auVar91._4_4_;
                            auVar160._8_4_ = auVar89._8_4_ * auVar91._8_4_;
                            auVar160._12_4_ = auVar89._12_4_ * auVar91._12_4_;
                            auVar90 = vfmsub231ps_fma(auVar160,auVar90,auVar88);
                            auVar213._8_4_ = 1;
                            auVar213._0_8_ = 0x100000001;
                            auVar213._12_4_ = 1;
                            auVar213._16_4_ = 1;
                            auVar213._20_4_ = 1;
                            auVar213._24_4_ = 1;
                            auVar213._28_4_ = 1;
                            auVar102 = vpermps_avx2(auVar213,ZEXT1632(auVar90));
                            auVar227._8_4_ = 2;
                            auVar227._0_8_ = 0x200000002;
                            auVar227._12_4_ = 2;
                            auVar227._16_4_ = 2;
                            auVar227._20_4_ = 2;
                            auVar227._24_4_ = 2;
                            auVar227._28_4_ = 2;
                            local_580 = vpermps_avx2(auVar227,ZEXT1632(auVar90));
                            local_560 = auVar90._0_4_;
                            local_5a0[0] = (RTCHitN)auVar102[0];
                            local_5a0[1] = (RTCHitN)auVar102[1];
                            local_5a0[2] = (RTCHitN)auVar102[2];
                            local_5a0[3] = (RTCHitN)auVar102[3];
                            local_5a0[4] = (RTCHitN)auVar102[4];
                            local_5a0[5] = (RTCHitN)auVar102[5];
                            local_5a0[6] = (RTCHitN)auVar102[6];
                            local_5a0[7] = (RTCHitN)auVar102[7];
                            local_5a0[8] = (RTCHitN)auVar102[8];
                            local_5a0[9] = (RTCHitN)auVar102[9];
                            local_5a0[10] = (RTCHitN)auVar102[10];
                            local_5a0[0xb] = (RTCHitN)auVar102[0xb];
                            local_5a0[0xc] = (RTCHitN)auVar102[0xc];
                            local_5a0[0xd] = (RTCHitN)auVar102[0xd];
                            local_5a0[0xe] = (RTCHitN)auVar102[0xe];
                            local_5a0[0xf] = (RTCHitN)auVar102[0xf];
                            local_5a0[0x10] = (RTCHitN)auVar102[0x10];
                            local_5a0[0x11] = (RTCHitN)auVar102[0x11];
                            local_5a0[0x12] = (RTCHitN)auVar102[0x12];
                            local_5a0[0x13] = (RTCHitN)auVar102[0x13];
                            local_5a0[0x14] = (RTCHitN)auVar102[0x14];
                            local_5a0[0x15] = (RTCHitN)auVar102[0x15];
                            local_5a0[0x16] = (RTCHitN)auVar102[0x16];
                            local_5a0[0x17] = (RTCHitN)auVar102[0x17];
                            local_5a0[0x18] = (RTCHitN)auVar102[0x18];
                            local_5a0[0x19] = (RTCHitN)auVar102[0x19];
                            local_5a0[0x1a] = (RTCHitN)auVar102[0x1a];
                            local_5a0[0x1b] = (RTCHitN)auVar102[0x1b];
                            local_5a0[0x1c] = (RTCHitN)auVar102[0x1c];
                            local_5a0[0x1d] = (RTCHitN)auVar102[0x1d];
                            local_5a0[0x1e] = (RTCHitN)auVar102[0x1e];
                            local_5a0[0x1f] = (RTCHitN)auVar102[0x1f];
                            uStack_55c = local_560;
                            uStack_558 = local_560;
                            uStack_554 = local_560;
                            uStack_550 = local_560;
                            uStack_54c = local_560;
                            uStack_548 = local_560;
                            uStack_544 = local_560;
                            local_540 = fVar256;
                            fStack_53c = fVar256;
                            fStack_538 = fVar256;
                            fStack_534 = fVar256;
                            fStack_530 = fVar256;
                            fStack_52c = fVar256;
                            fStack_528 = fVar256;
                            fStack_524 = fVar256;
                            local_520 = ZEXT432(0) << 0x20;
                            local_500 = local_660._0_8_;
                            uStack_4f8 = local_660._8_8_;
                            uStack_4f0 = local_660._16_8_;
                            uStack_4e8 = local_660._24_8_;
                            local_4e0 = local_680;
                            vpcmpeqd_avx2(local_680,local_680);
                            local_4c0 = context->user->instID[0];
                            uStack_4bc = local_4c0;
                            uStack_4b8 = local_4c0;
                            uStack_4b4 = local_4c0;
                            uStack_4b0 = local_4c0;
                            uStack_4ac = local_4c0;
                            uStack_4a8 = local_4c0;
                            uStack_4a4 = local_4c0;
                            local_4a0 = context->user->instPrimID[0];
                            uStack_49c = local_4a0;
                            uStack_498 = local_4a0;
                            uStack_494 = local_4a0;
                            uStack_490 = local_4a0;
                            uStack_48c = local_4a0;
                            uStack_488 = local_4a0;
                            uStack_484 = local_4a0;
                            *(float *)(ray + k * 4 + 0x100) = fVar253;
                            local_800 = local_6a0._0_8_;
                            uStack_7f8 = local_6a0._8_8_;
                            uStack_7f0 = local_6a0._16_8_;
                            uStack_7e8 = local_6a0._24_8_;
                            local_910.valid = (int *)&local_800;
                            local_910.geometryUserPtr = pGVar3->userPtr;
                            local_910.context = context->user;
                            local_910.hit = local_5a0;
                            local_910.N = 8;
                            local_910.ray = (RTCRayN *)ray;
                            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar251 = ZEXT1664(local_8c0._0_16_);
                              auVar259 = ZEXT1664(auVar158);
                              auVar263 = ZEXT1664(auVar1);
                              auVar266 = ZEXT1664(auVar92);
                              (*pGVar3->occlusionFilterN)(&local_910);
                              auVar249 = ZEXT1664(ZEXT416((uint)fVar253));
                              auVar257 = ZEXT1664(ZEXT416((uint)fVar256));
                              auVar233._8_4_ = 0x7fffffff;
                              auVar233._0_8_ = 0x7fffffff7fffffff;
                              auVar233._12_4_ = 0x7fffffff;
                              auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar268 = ZEXT3264(auVar102);
                            }
                            auVar62._8_8_ = uStack_7f8;
                            auVar62._0_8_ = local_800;
                            auVar62._16_8_ = uStack_7f0;
                            auVar62._24_8_ = uStack_7e8;
                            if (auVar62 == (undefined1  [32])0x0) {
                              bVar79 = false;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar251 = ZEXT1664(auVar251._0_16_);
                                auVar259 = ZEXT1664(auVar259._0_16_);
                                auVar263 = ZEXT1664(auVar263._0_16_);
                                auVar266 = ZEXT1664(auVar266._0_16_);
                                (*p_Var4)(&local_910);
                                auVar249 = ZEXT1664(ZEXT416((uint)fVar253));
                                auVar257 = ZEXT1664(ZEXT416((uint)fVar256));
                                auVar233._8_4_ = 0x7fffffff;
                                auVar233._0_8_ = 0x7fffffff7fffffff;
                                auVar233._12_4_ = 0x7fffffff;
                                auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar268 = ZEXT3264(auVar102);
                              }
                              auVar63._8_8_ = uStack_7f8;
                              auVar63._0_8_ = local_800;
                              auVar63._16_8_ = uStack_7f0;
                              auVar63._24_8_ = uStack_7e8;
                              uVar86 = vptestmd_avx512vl(auVar63,auVar63);
                              auVar102 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                              bVar84 = (bool)((byte)uVar86 & 1);
                              bVar5 = (bool)((byte)(uVar86 >> 1) & 1);
                              bVar6 = (bool)((byte)(uVar86 >> 2) & 1);
                              bVar7 = (bool)((byte)(uVar86 >> 3) & 1);
                              bVar8 = (bool)((byte)(uVar86 >> 4) & 1);
                              bVar9 = (bool)((byte)(uVar86 >> 5) & 1);
                              bVar10 = (bool)((byte)(uVar86 >> 6) & 1);
                              bVar11 = SUB81(uVar86 >> 7,0);
                              *(uint *)(local_910.ray + 0x100) =
                                   (uint)bVar84 * auVar102._0_4_ |
                                   (uint)!bVar84 * *(int *)(local_910.ray + 0x100);
                              *(uint *)(local_910.ray + 0x104) =
                                   (uint)bVar5 * auVar102._4_4_ |
                                   (uint)!bVar5 * *(int *)(local_910.ray + 0x104);
                              *(uint *)(local_910.ray + 0x108) =
                                   (uint)bVar6 * auVar102._8_4_ |
                                   (uint)!bVar6 * *(int *)(local_910.ray + 0x108);
                              *(uint *)(local_910.ray + 0x10c) =
                                   (uint)bVar7 * auVar102._12_4_ |
                                   (uint)!bVar7 * *(int *)(local_910.ray + 0x10c);
                              *(uint *)(local_910.ray + 0x110) =
                                   (uint)bVar8 * auVar102._16_4_ |
                                   (uint)!bVar8 * *(int *)(local_910.ray + 0x110);
                              *(uint *)(local_910.ray + 0x114) =
                                   (uint)bVar9 * auVar102._20_4_ |
                                   (uint)!bVar9 * *(int *)(local_910.ray + 0x114);
                              *(uint *)(local_910.ray + 0x118) =
                                   (uint)bVar10 * auVar102._24_4_ |
                                   (uint)!bVar10 * *(int *)(local_910.ray + 0x118);
                              *(uint *)(local_910.ray + 0x11c) =
                                   (uint)bVar11 * auVar102._28_4_ |
                                   (uint)!bVar11 * *(int *)(local_910.ray + 0x11c);
                              bVar79 = auVar63 != (undefined1  [32])0x0;
                            }
                            if ((bool)bVar79 == false) {
                              *(float *)(ray + k * 4 + 0x100) = fVar254;
                            }
                          }
                          auVar243 = ZEXT464((uint)fVar254);
                          bVar84 = false;
                          goto LAB_01d46a9e;
                        }
                      }
                    }
                    bVar84 = false;
                    bVar79 = 0;
                  }
                }
LAB_01d46a9e:
                if (!bVar84) goto LAB_01d46dd9;
                lVar83 = lVar83 + -1;
              } while (lVar83 != 0);
              bVar79 = 0;
LAB_01d46dd9:
              bVar75 = bVar75 | bVar79 & 1;
              auVar68._4_4_ = fStack_6fc;
              auVar68._0_4_ = local_700;
              auVar68._8_4_ = fStack_6f8;
              auVar68._12_4_ = fStack_6f4;
              auVar68._16_4_ = fStack_6f0;
              auVar68._20_4_ = fStack_6ec;
              auVar68._24_4_ = fStack_6e8;
              auVar68._28_4_ = fStack_6e4;
              uVar155 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar25._4_4_ = uVar155;
              auVar25._0_4_ = uVar155;
              auVar25._8_4_ = uVar155;
              auVar25._12_4_ = uVar155;
              auVar25._16_4_ = uVar155;
              auVar25._20_4_ = uVar155;
              auVar25._24_4_ = uVar155;
              auVar25._28_4_ = uVar155;
              uVar16 = vcmpps_avx512vl(auVar68,auVar25,2);
              bVar77 = bVar72 & bVar77 & (byte)uVar16;
            } while (bVar77 != 0);
          }
          auVar170._0_4_ = (float)local_740._0_4_ + (float)local_720._0_4_;
          auVar170._4_4_ = (float)local_740._4_4_ + (float)local_720._4_4_;
          auVar170._8_4_ = fStack_738 + fStack_718;
          auVar170._12_4_ = fStack_734 + fStack_714;
          auVar170._16_4_ = fStack_730 + fStack_710;
          auVar170._20_4_ = fStack_72c + fStack_70c;
          auVar170._24_4_ = fStack_728 + fStack_708;
          auVar170._28_4_ = fStack_724 + fStack_704;
          uVar155 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar26._4_4_ = uVar155;
          auVar26._0_4_ = uVar155;
          auVar26._8_4_ = uVar155;
          auVar26._12_4_ = uVar155;
          auVar26._16_4_ = uVar155;
          auVar26._20_4_ = uVar155;
          auVar26._24_4_ = uVar155;
          auVar26._28_4_ = uVar155;
          uVar16 = vcmpps_avx512vl(auVar170,auVar26,2);
          bVar78 = (byte)uVar14 | ~bVar78;
          bVar71 = (byte)uVar15 & bVar71 & (byte)uVar16;
          auVar171._8_4_ = 2;
          auVar171._0_8_ = 0x200000002;
          auVar171._12_4_ = 2;
          auVar171._16_4_ = 2;
          auVar171._20_4_ = 2;
          auVar171._24_4_ = 2;
          auVar171._28_4_ = 2;
          auVar27._8_4_ = 3;
          auVar27._0_8_ = 0x300000003;
          auVar27._12_4_ = 3;
          auVar27._16_4_ = 3;
          auVar27._20_4_ = 3;
          auVar27._24_4_ = 3;
          auVar27._28_4_ = 3;
          auVar102 = vpblendmd_avx512vl(auVar171,auVar27);
          local_720._0_4_ = (uint)(bVar78 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar78 & 1) * 2;
          bVar84 = (bool)(bVar78 >> 1 & 1);
          local_720._4_4_ = (uint)bVar84 * auVar102._4_4_ | (uint)!bVar84 * 2;
          bVar84 = (bool)(bVar78 >> 2 & 1);
          fStack_718 = (float)((uint)bVar84 * auVar102._8_4_ | (uint)!bVar84 * 2);
          bVar84 = (bool)(bVar78 >> 3 & 1);
          fStack_714 = (float)((uint)bVar84 * auVar102._12_4_ | (uint)!bVar84 * 2);
          bVar84 = (bool)(bVar78 >> 4 & 1);
          fStack_710 = (float)((uint)bVar84 * auVar102._16_4_ | (uint)!bVar84 * 2);
          bVar84 = (bool)(bVar78 >> 5 & 1);
          fStack_70c = (float)((uint)bVar84 * auVar102._20_4_ | (uint)!bVar84 * 2);
          bVar84 = (bool)(bVar78 >> 6 & 1);
          fStack_708 = (float)((uint)bVar84 * auVar102._24_4_ | (uint)!bVar84 * 2);
          fStack_704 = (float)((uint)(bVar78 >> 7) * auVar102._28_4_ |
                              (uint)!(bool)(bVar78 >> 7) * 2);
          uVar14 = vpcmpd_avx512vl(_local_720,local_640,2);
          bVar78 = (byte)uVar14 & bVar71;
          if (bVar78 != 0) {
            auVar88 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar90 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar1 = vminps_avx(local_840._0_16_,local_880._0_16_);
            auVar91 = vminps_avx(auVar88,auVar1);
            auVar88 = vmaxps_avx(local_840._0_16_,local_880._0_16_);
            auVar1 = vmaxps_avx(auVar90,auVar88);
            auVar90 = vandps_avx(auVar91,auVar233);
            auVar88 = vandps_avx(auVar1,auVar233);
            auVar90 = vmaxps_avx(auVar90,auVar88);
            auVar88 = vmovshdup_avx(auVar90);
            auVar88 = vmaxss_avx(auVar88,auVar90);
            auVar90 = vshufpd_avx(auVar90,auVar90,1);
            auVar90 = vmaxss_avx(auVar90,auVar88);
            fVar250 = auVar90._0_4_ * 1.9073486e-06;
            local_7e0 = vshufps_avx(auVar1,auVar1,0xff);
            _local_760 = _local_480;
            local_700 = (float)local_740._0_4_ + (float)local_480._0_4_;
            fStack_6fc = (float)local_740._4_4_ + (float)local_480._4_4_;
            fStack_6f8 = fStack_738 + fStack_478;
            fStack_6f4 = fStack_734 + fStack_474;
            fStack_6f0 = fStack_730 + fStack_470;
            fStack_6ec = fStack_72c + fStack_46c;
            fStack_6e8 = fStack_728 + fStack_468;
            fStack_6e4 = fStack_724 + fStack_464;
            do {
              auVar172._8_4_ = 0x7f800000;
              auVar172._0_8_ = 0x7f8000007f800000;
              auVar172._12_4_ = 0x7f800000;
              auVar172._16_4_ = 0x7f800000;
              auVar172._20_4_ = 0x7f800000;
              auVar172._24_4_ = 0x7f800000;
              auVar172._28_4_ = 0x7f800000;
              auVar102 = vblendmps_avx512vl(auVar172,_local_760);
              auVar141._0_4_ =
                   (uint)(bVar78 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar78 & 1) * 0x7f800000;
              bVar84 = (bool)(bVar78 >> 1 & 1);
              auVar141._4_4_ = (uint)bVar84 * auVar102._4_4_ | (uint)!bVar84 * 0x7f800000;
              bVar84 = (bool)(bVar78 >> 2 & 1);
              auVar141._8_4_ = (uint)bVar84 * auVar102._8_4_ | (uint)!bVar84 * 0x7f800000;
              bVar84 = (bool)(bVar78 >> 3 & 1);
              auVar141._12_4_ = (uint)bVar84 * auVar102._12_4_ | (uint)!bVar84 * 0x7f800000;
              bVar84 = (bool)(bVar78 >> 4 & 1);
              auVar141._16_4_ = (uint)bVar84 * auVar102._16_4_ | (uint)!bVar84 * 0x7f800000;
              bVar84 = (bool)(bVar78 >> 5 & 1);
              auVar141._20_4_ = (uint)bVar84 * auVar102._20_4_ | (uint)!bVar84 * 0x7f800000;
              auVar141._24_4_ =
                   (uint)(bVar78 >> 6) * auVar102._24_4_ | (uint)!(bool)(bVar78 >> 6) * 0x7f800000;
              auVar141._28_4_ = 0x7f800000;
              auVar102 = vshufps_avx(auVar141,auVar141,0xb1);
              auVar102 = vminps_avx(auVar141,auVar102);
              auVar101 = vshufpd_avx(auVar102,auVar102,5);
              auVar102 = vminps_avx(auVar102,auVar101);
              auVar101 = vpermpd_avx2(auVar102,0x4e);
              auVar102 = vminps_avx(auVar102,auVar101);
              uVar14 = vcmpps_avx512vl(auVar141,auVar102,0);
              bVar79 = (byte)uVar14 & bVar78;
              bVar77 = bVar78;
              if (bVar79 != 0) {
                bVar77 = bVar79;
              }
              iVar17 = 0;
              for (uVar87 = (uint)bVar77; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              bVar77 = '\x01' << ((byte)iVar17 & 0x1f);
              uVar87 = *(uint *)(local_6e0 + (uint)(iVar17 << 2));
              uVar147 = *(uint *)(local_460 + (uint)(iVar17 << 2));
              fVar252 = auVar12._0_4_;
              if ((float)local_8a0._0_4_ < 0.0) {
                fVar252 = sqrtf((float)local_8a0._0_4_);
              }
              auVar257 = ZEXT464(uVar87);
              auVar249 = ZEXT464(uVar147);
              bVar79 = ~bVar77;
              lVar83 = 5;
              do {
                fVar253 = auVar249._0_4_;
                auVar161._4_4_ = fVar253;
                auVar161._0_4_ = fVar253;
                auVar161._8_4_ = fVar253;
                auVar161._12_4_ = fVar253;
                auVar90 = vfmadd132ps_fma(auVar161,ZEXT816(0) << 0x40,local_890);
                fVar256 = auVar257._0_4_;
                fVar241 = 1.0 - fVar256;
                fVar245 = fVar241 * fVar241 * fVar241;
                fVar220 = fVar256 * fVar256 * fVar256;
                auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar245),
                                          ZEXT416((uint)fVar220));
                fVar254 = fVar256 * fVar241;
                auVar231 = ZEXT416((uint)fVar241);
                auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar256 * fVar254 * 6.0)),
                                          ZEXT416((uint)(fVar254 * fVar241)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar220),
                                         ZEXT416((uint)fVar245));
                auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * fVar241 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar256 * fVar254)));
                fVar245 = fVar245 * 0.16666667;
                fVar246 = (auVar88._0_4_ + auVar91._0_4_) * 0.16666667;
                fVar255 = (auVar1._0_4_ + auVar89._0_4_) * 0.16666667;
                fVar220 = fVar220 * 0.16666667;
                auVar207._0_4_ = fVar220 * (float)local_880._0_4_;
                auVar207._4_4_ = fVar220 * (float)local_880._4_4_;
                auVar207._8_4_ = fVar220 * fStack_878;
                auVar207._12_4_ = fVar220 * fStack_874;
                auVar234._4_4_ = fVar255;
                auVar234._0_4_ = fVar255;
                auVar234._8_4_ = fVar255;
                auVar234._12_4_ = fVar255;
                auVar88 = vfmadd132ps_fma(auVar234,auVar207,local_840._0_16_);
                auVar208._4_4_ = fVar246;
                auVar208._0_4_ = fVar246;
                auVar208._8_4_ = fVar246;
                auVar208._12_4_ = fVar246;
                auVar88 = vfmadd132ps_fma(auVar208,auVar88,local_860._0_16_);
                auVar187._4_4_ = fVar245;
                auVar187._0_4_ = fVar245;
                auVar187._8_4_ = fVar245;
                auVar187._12_4_ = fVar245;
                local_770 = vfmadd132ps_fma(auVar187,auVar88,local_820._0_16_);
                auVar90 = vsubps_avx(auVar90,local_770);
                local_8c0._0_16_ = auVar90;
                auVar90 = vdpps_avx(auVar90,auVar90,0x7f);
                auVar88 = auVar257._0_16_;
                local_8e0._0_16_ = auVar90;
                if (auVar90._0_4_ < 0.0) {
                  auVar243._0_4_ = sqrtf(auVar90._0_4_);
                  auVar243._4_60_ = extraout_var_00;
                  auVar90 = auVar243._0_16_;
                }
                else {
                  auVar90 = vsqrtss_avx(auVar90,auVar90);
                }
                auVar91 = vfnmsub213ss_fma(auVar88,auVar88,ZEXT416((uint)(fVar254 * 4.0)));
                auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * 4.0)),auVar231,auVar231);
                fVar254 = fVar241 * -fVar241 * 0.5;
                fVar245 = auVar91._0_4_ * 0.5;
                fVar246 = auVar1._0_4_ * 0.5;
                fVar255 = fVar256 * fVar256 * 0.5;
                auVar223._0_4_ = fVar255 * (float)local_880._0_4_;
                auVar223._4_4_ = fVar255 * (float)local_880._4_4_;
                auVar223._8_4_ = fVar255 * fStack_878;
                auVar223._12_4_ = fVar255 * fStack_874;
                auVar188._4_4_ = fVar246;
                auVar188._0_4_ = fVar246;
                auVar188._8_4_ = fVar246;
                auVar188._12_4_ = fVar246;
                auVar1 = vfmadd132ps_fma(auVar188,auVar223,local_840._0_16_);
                auVar209._4_4_ = fVar245;
                auVar209._0_4_ = fVar245;
                auVar209._8_4_ = fVar245;
                auVar209._12_4_ = fVar245;
                auVar1 = vfmadd132ps_fma(auVar209,auVar1,local_860._0_16_);
                auVar262._4_4_ = fVar254;
                auVar262._0_4_ = fVar254;
                auVar262._8_4_ = fVar254;
                auVar262._12_4_ = fVar254;
                auVar1 = vfmadd132ps_fma(auVar262,auVar1,local_820._0_16_);
                local_790 = vdpps_avx(auVar1,auVar1,0x7f);
                auVar61._12_4_ = 0;
                auVar61._0_12_ = ZEXT812(0);
                fVar254 = local_790._0_4_;
                auVar91 = vrsqrt14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar254));
                fVar245 = auVar91._0_4_;
                local_7a0 = vrcp14ss_avx512f(auVar61 << 0x20,ZEXT416((uint)fVar254));
                auVar91 = vfnmadd213ss_fma(local_7a0,local_790,ZEXT416(0x40000000));
                uVar87 = auVar90._0_4_;
                local_780 = fVar241;
                fStack_77c = fVar241;
                fStack_778 = fVar241;
                fStack_774 = fVar241;
                if (fVar254 < -fVar254) {
                  fVar246 = sqrtf(fVar254);
                  auVar90 = ZEXT416(uVar87);
                }
                else {
                  auVar89 = vsqrtss_avx(local_790,local_790);
                  fVar246 = auVar89._0_4_;
                }
                fVar254 = fVar245 * 1.5 + fVar254 * -0.5 * fVar245 * fVar245 * fVar245;
                auVar162._0_4_ = auVar1._0_4_ * fVar254;
                auVar162._4_4_ = auVar1._4_4_ * fVar254;
                auVar162._8_4_ = auVar1._8_4_ * fVar254;
                auVar162._12_4_ = auVar1._12_4_ * fVar254;
                auVar89 = vdpps_avx(local_8c0._0_16_,auVar162,0x7f);
                fVar220 = auVar90._0_4_;
                fVar245 = auVar89._0_4_;
                auVar163._0_4_ = fVar245 * fVar245;
                auVar163._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                auVar163._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                auVar163._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                auVar92 = vsubps_avx512vl(local_8e0._0_16_,auVar163);
                fVar255 = auVar92._0_4_;
                auVar189._4_12_ = ZEXT812(0) << 0x20;
                auVar189._0_4_ = fVar255;
                auVar93 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
                auVar94 = vmulss_avx512f(auVar93,ZEXT416(0x3fc00000));
                auVar95 = vmulss_avx512f(auVar92,ZEXT416(0xbf000000));
                if (fVar255 < 0.0) {
                  local_7c0 = fVar254;
                  fStack_7bc = fVar254;
                  fStack_7b8 = fVar254;
                  fStack_7b4 = fVar254;
                  local_7b0 = auVar93;
                  fVar255 = sqrtf(fVar255);
                  auVar95 = ZEXT416(auVar95._0_4_);
                  auVar94 = ZEXT416(auVar94._0_4_);
                  auVar90 = ZEXT416(uVar87);
                  auVar93 = local_7b0;
                  fVar254 = local_7c0;
                  fVar241 = fStack_7bc;
                  fVar242 = fStack_7b8;
                  fVar247 = fStack_7b4;
                }
                else {
                  auVar92 = vsqrtss_avx(auVar92,auVar92);
                  fVar255 = auVar92._0_4_;
                  fVar241 = fVar254;
                  fVar242 = fVar254;
                  fVar247 = fVar254;
                }
                auVar263 = ZEXT1664(auVar1);
                auVar251 = ZEXT1664(local_8c0._0_16_);
                auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar268 = ZEXT3264(auVar102);
                auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar231,auVar88);
                auVar88 = vfmadd231ss_fma(auVar231,auVar88,SUB6416(ZEXT464(0xc0000000),0));
                auVar210._0_4_ = fVar256 * (float)local_880._0_4_;
                auVar210._4_4_ = fVar256 * (float)local_880._4_4_;
                auVar210._8_4_ = fVar256 * fStack_878;
                auVar210._12_4_ = fVar256 * fStack_874;
                auVar224._0_4_ = auVar88._0_4_;
                auVar224._4_4_ = auVar224._0_4_;
                auVar224._8_4_ = auVar224._0_4_;
                auVar224._12_4_ = auVar224._0_4_;
                auVar88 = vfmadd132ps_fma(auVar224,auVar210,local_840._0_16_);
                auVar190._0_4_ = auVar92._0_4_;
                auVar190._4_4_ = auVar190._0_4_;
                auVar190._8_4_ = auVar190._0_4_;
                auVar190._12_4_ = auVar190._0_4_;
                auVar88 = vfmadd132ps_fma(auVar190,auVar88,local_860._0_16_);
                auVar67._4_4_ = fStack_77c;
                auVar67._0_4_ = local_780;
                auVar67._8_4_ = fStack_778;
                auVar67._12_4_ = fStack_774;
                auVar88 = vfmadd132ps_fma(auVar67,auVar88,local_820._0_16_);
                auVar191._0_4_ = auVar88._0_4_ * (float)local_790._0_4_;
                auVar191._4_4_ = auVar88._4_4_ * (float)local_790._0_4_;
                auVar191._8_4_ = auVar88._8_4_ * (float)local_790._0_4_;
                auVar191._12_4_ = auVar88._12_4_ * (float)local_790._0_4_;
                auVar88 = vdpps_avx(auVar1,auVar88,0x7f);
                fVar260 = auVar88._0_4_;
                auVar211._0_4_ = auVar1._0_4_ * fVar260;
                auVar211._4_4_ = auVar1._4_4_ * fVar260;
                auVar211._8_4_ = auVar1._8_4_ * fVar260;
                auVar211._12_4_ = auVar1._12_4_ * fVar260;
                auVar88 = vsubps_avx(auVar191,auVar211);
                fVar260 = auVar91._0_4_ * (float)local_7a0._0_4_;
                auVar231 = vmaxss_avx(ZEXT416((uint)fVar250),
                                      ZEXT416((uint)(fVar253 * fVar252 * 1.9073486e-06)));
                auVar19._8_4_ = 0x80000000;
                auVar19._0_8_ = 0x8000000080000000;
                auVar19._12_4_ = 0x80000000;
                auVar143._16_16_ = auVar102._16_16_;
                auVar96 = vxorps_avx512vl(auVar1,auVar19);
                auVar212._0_4_ = fVar254 * auVar88._0_4_ * fVar260;
                auVar212._4_4_ = fVar241 * auVar88._4_4_ * fVar260;
                auVar212._8_4_ = fVar242 * auVar88._8_4_ * fVar260;
                auVar212._12_4_ = fVar247 * auVar88._12_4_ * fVar260;
                auVar259 = ZEXT1664(auVar162);
                auVar88 = vdpps_avx(auVar96,auVar162,0x7f);
                auVar91 = vfmadd213ss_fma(auVar90,ZEXT416((uint)fVar250),auVar231);
                auVar90 = vdpps_avx(local_8c0._0_16_,auVar212,0x7f);
                auVar92 = vfmadd213ss_fma(ZEXT416((uint)(fVar220 + 1.0)),
                                          ZEXT416((uint)(fVar250 / fVar246)),auVar91);
                auVar266 = ZEXT1664(auVar92);
                fVar254 = auVar88._0_4_ + auVar90._0_4_;
                auVar90 = vdpps_avx(local_890,auVar162,0x7f);
                auVar88 = vdpps_avx(local_8c0._0_16_,auVar96,0x7f);
                auVar91 = vmulss_avx512f(auVar95,auVar93);
                auVar95 = vaddss_avx512f(auVar94,ZEXT416((uint)(auVar91._0_4_ *
                                                               auVar93._0_4_ * auVar93._0_4_)));
                auVar91 = vdpps_avx(local_8c0._0_16_,local_890,0x7f);
                auVar93 = vfnmadd231ss_fma(auVar88,auVar89,ZEXT416((uint)fVar254));
                auVar94 = vfnmadd231ss_fma(auVar91,auVar89,auVar90);
                auVar88 = vpermilps_avx(local_770,0xff);
                fVar255 = fVar255 - auVar88._0_4_;
                auVar88 = vshufps_avx(auVar1,auVar1,0xff);
                auVar91 = vfmsub213ss_fma(auVar93,auVar95,auVar88);
                fVar246 = auVar94._0_4_ * auVar95._0_4_;
                auVar93 = vfmsub231ss_fma(ZEXT416((uint)(auVar90._0_4_ * auVar91._0_4_)),
                                          ZEXT416((uint)fVar254),ZEXT416((uint)fVar246));
                fVar220 = auVar93._0_4_;
                fVar246 = fVar245 * (fVar246 / fVar220) - fVar255 * (auVar90._0_4_ / fVar220);
                auVar243 = ZEXT464((uint)fVar246);
                fVar256 = fVar256 - fVar246;
                auVar257 = ZEXT464((uint)fVar256);
                fVar253 = fVar253 - (fVar255 * (fVar254 / fVar220) -
                                    fVar245 * (auVar91._0_4_ / fVar220));
                auVar249 = ZEXT464((uint)fVar253);
                auVar235._8_4_ = 0x7fffffff;
                auVar235._0_8_ = 0x7fffffff7fffffff;
                auVar235._12_4_ = 0x7fffffff;
                auVar90 = vandps_avx(auVar89,auVar235);
                bVar84 = true;
                if (auVar90._0_4_ < auVar92._0_4_) {
                  auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar92._0_4_ + auVar231._0_4_)),
                                            local_7e0,ZEXT416(0x36000000));
                  auVar90 = vandps_avx(ZEXT416((uint)fVar255),auVar235);
                  if (auVar90._0_4_ < auVar91._0_4_) {
                    fVar253 = fVar253 + (float)local_7d0._0_4_;
                    auVar249 = ZEXT464((uint)fVar253);
                    if ((((fVar154 <= fVar253) &&
                         (fVar254 = *(float *)(ray + k * 4 + 0x100), fVar253 <= fVar254)) &&
                        (0.0 <= fVar256)) && (fVar256 <= 1.0)) {
                      auVar143._0_16_ = ZEXT816(0) << 0x20;
                      auVar142._4_28_ = auVar143._4_28_;
                      auVar142._0_4_ = local_8e0._0_4_;
                      auVar90 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar142._0_16_);
                      fVar245 = auVar90._0_4_;
                      auVar90 = vmulss_avx512f(local_8e0._0_16_,ZEXT416(0xbf000000));
                      pGVar3 = (context->scene->geometries).items[uVar80].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          bVar77 = true;
                        }
                        else {
                          fVar245 = fVar245 * 1.5 + auVar90._0_4_ * fVar245 * fVar245 * fVar245;
                          auVar192._0_4_ = local_8c0._0_4_ * fVar245;
                          auVar192._4_4_ = local_8c0._4_4_ * fVar245;
                          auVar192._8_4_ = local_8c0._8_4_ * fVar245;
                          auVar192._12_4_ = local_8c0._12_4_ * fVar245;
                          auVar89 = vfmadd213ps_fma(auVar88,auVar192,auVar1);
                          auVar90 = vshufps_avx(auVar192,auVar192,0xc9);
                          auVar88 = vshufps_avx(auVar1,auVar1,0xc9);
                          auVar193._0_4_ = auVar192._0_4_ * auVar88._0_4_;
                          auVar193._4_4_ = auVar192._4_4_ * auVar88._4_4_;
                          auVar193._8_4_ = auVar192._8_4_ * auVar88._8_4_;
                          auVar193._12_4_ = auVar192._12_4_ * auVar88._12_4_;
                          auVar91 = vfmsub231ps_fma(auVar193,auVar1,auVar90);
                          auVar90 = vshufps_avx(auVar91,auVar91,0xc9);
                          auVar88 = vshufps_avx(auVar89,auVar89,0xc9);
                          auVar91 = vshufps_avx(auVar91,auVar91,0xd2);
                          auVar164._0_4_ = auVar89._0_4_ * auVar91._0_4_;
                          auVar164._4_4_ = auVar89._4_4_ * auVar91._4_4_;
                          auVar164._8_4_ = auVar89._8_4_ * auVar91._8_4_;
                          auVar164._12_4_ = auVar89._12_4_ * auVar91._12_4_;
                          auVar90 = vfmsub231ps_fma(auVar164,auVar90,auVar88);
                          auVar214._8_4_ = 1;
                          auVar214._0_8_ = 0x100000001;
                          auVar214._12_4_ = 1;
                          auVar214._16_4_ = 1;
                          auVar214._20_4_ = 1;
                          auVar214._24_4_ = 1;
                          auVar214._28_4_ = 1;
                          auVar102 = vpermps_avx2(auVar214,ZEXT1632(auVar90));
                          auVar228._8_4_ = 2;
                          auVar228._0_8_ = 0x200000002;
                          auVar228._12_4_ = 2;
                          auVar228._16_4_ = 2;
                          auVar228._20_4_ = 2;
                          auVar228._24_4_ = 2;
                          auVar228._28_4_ = 2;
                          local_580 = vpermps_avx2(auVar228,ZEXT1632(auVar90));
                          local_560 = auVar90._0_4_;
                          local_5a0[0] = (RTCHitN)auVar102[0];
                          local_5a0[1] = (RTCHitN)auVar102[1];
                          local_5a0[2] = (RTCHitN)auVar102[2];
                          local_5a0[3] = (RTCHitN)auVar102[3];
                          local_5a0[4] = (RTCHitN)auVar102[4];
                          local_5a0[5] = (RTCHitN)auVar102[5];
                          local_5a0[6] = (RTCHitN)auVar102[6];
                          local_5a0[7] = (RTCHitN)auVar102[7];
                          local_5a0[8] = (RTCHitN)auVar102[8];
                          local_5a0[9] = (RTCHitN)auVar102[9];
                          local_5a0[10] = (RTCHitN)auVar102[10];
                          local_5a0[0xb] = (RTCHitN)auVar102[0xb];
                          local_5a0[0xc] = (RTCHitN)auVar102[0xc];
                          local_5a0[0xd] = (RTCHitN)auVar102[0xd];
                          local_5a0[0xe] = (RTCHitN)auVar102[0xe];
                          local_5a0[0xf] = (RTCHitN)auVar102[0xf];
                          local_5a0[0x10] = (RTCHitN)auVar102[0x10];
                          local_5a0[0x11] = (RTCHitN)auVar102[0x11];
                          local_5a0[0x12] = (RTCHitN)auVar102[0x12];
                          local_5a0[0x13] = (RTCHitN)auVar102[0x13];
                          local_5a0[0x14] = (RTCHitN)auVar102[0x14];
                          local_5a0[0x15] = (RTCHitN)auVar102[0x15];
                          local_5a0[0x16] = (RTCHitN)auVar102[0x16];
                          local_5a0[0x17] = (RTCHitN)auVar102[0x17];
                          local_5a0[0x18] = (RTCHitN)auVar102[0x18];
                          local_5a0[0x19] = (RTCHitN)auVar102[0x19];
                          local_5a0[0x1a] = (RTCHitN)auVar102[0x1a];
                          local_5a0[0x1b] = (RTCHitN)auVar102[0x1b];
                          local_5a0[0x1c] = (RTCHitN)auVar102[0x1c];
                          local_5a0[0x1d] = (RTCHitN)auVar102[0x1d];
                          local_5a0[0x1e] = (RTCHitN)auVar102[0x1e];
                          local_5a0[0x1f] = (RTCHitN)auVar102[0x1f];
                          uStack_55c = local_560;
                          uStack_558 = local_560;
                          uStack_554 = local_560;
                          uStack_550 = local_560;
                          uStack_54c = local_560;
                          uStack_548 = local_560;
                          uStack_544 = local_560;
                          local_540 = fVar256;
                          fStack_53c = fVar256;
                          fStack_538 = fVar256;
                          fStack_534 = fVar256;
                          fStack_530 = fVar256;
                          fStack_52c = fVar256;
                          fStack_528 = fVar256;
                          fStack_524 = fVar256;
                          local_520 = ZEXT432(0) << 0x20;
                          local_500 = local_660._0_8_;
                          uStack_4f8 = local_660._8_8_;
                          uStack_4f0 = local_660._16_8_;
                          uStack_4e8 = local_660._24_8_;
                          local_4e0 = local_680;
                          vpcmpeqd_avx2(local_680,local_680);
                          local_4c0 = context->user->instID[0];
                          uStack_4bc = local_4c0;
                          uStack_4b8 = local_4c0;
                          uStack_4b4 = local_4c0;
                          uStack_4b0 = local_4c0;
                          uStack_4ac = local_4c0;
                          uStack_4a8 = local_4c0;
                          uStack_4a4 = local_4c0;
                          local_4a0 = context->user->instPrimID[0];
                          uStack_49c = local_4a0;
                          uStack_498 = local_4a0;
                          uStack_494 = local_4a0;
                          uStack_490 = local_4a0;
                          uStack_48c = local_4a0;
                          uStack_488 = local_4a0;
                          uStack_484 = local_4a0;
                          *(float *)(ray + k * 4 + 0x100) = fVar253;
                          local_800 = local_6a0._0_8_;
                          uStack_7f8 = local_6a0._8_8_;
                          uStack_7f0 = local_6a0._16_8_;
                          uStack_7e8 = local_6a0._24_8_;
                          local_910.valid = (int *)&local_800;
                          local_910.geometryUserPtr = pGVar3->userPtr;
                          local_910.context = context->user;
                          local_910.hit = local_5a0;
                          local_910.N = 8;
                          local_910.ray = (RTCRayN *)ray;
                          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar243 = ZEXT464((uint)fVar246);
                            auVar251 = ZEXT1664(local_8c0._0_16_);
                            auVar259 = ZEXT1664(auVar162);
                            auVar263 = ZEXT1664(auVar1);
                            auVar266 = ZEXT1664(auVar92);
                            (*pGVar3->occlusionFilterN)(&local_910);
                            auVar249 = ZEXT1664(ZEXT416((uint)fVar253));
                            auVar257 = ZEXT1664(ZEXT416((uint)fVar256));
                            auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar268 = ZEXT3264(auVar102);
                          }
                          auVar64._8_8_ = uStack_7f8;
                          auVar64._0_8_ = local_800;
                          auVar64._16_8_ = uStack_7f0;
                          auVar64._24_8_ = uStack_7e8;
                          if (auVar64 == (undefined1  [32])0x0) {
                            bVar77 = false;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar243 = ZEXT1664(auVar243._0_16_);
                              auVar251 = ZEXT1664(auVar251._0_16_);
                              auVar259 = ZEXT1664(auVar259._0_16_);
                              auVar263 = ZEXT1664(auVar263._0_16_);
                              auVar266 = ZEXT1664(auVar266._0_16_);
                              (*p_Var4)(&local_910);
                              auVar249 = ZEXT1664(ZEXT416((uint)fVar253));
                              auVar257 = ZEXT1664(ZEXT416((uint)fVar256));
                              auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar268 = ZEXT3264(auVar102);
                            }
                            auVar65._8_8_ = uStack_7f8;
                            auVar65._0_8_ = local_800;
                            auVar65._16_8_ = uStack_7f0;
                            auVar65._24_8_ = uStack_7e8;
                            uVar86 = vptestmd_avx512vl(auVar65,auVar65);
                            auVar102 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                            bVar84 = (bool)((byte)uVar86 & 1);
                            auVar144._0_4_ =
                                 (uint)bVar84 * auVar102._0_4_ |
                                 (uint)!bVar84 * *(int *)(local_910.ray + 0x100);
                            bVar84 = (bool)((byte)(uVar86 >> 1) & 1);
                            auVar144._4_4_ =
                                 (uint)bVar84 * auVar102._4_4_ |
                                 (uint)!bVar84 * *(int *)(local_910.ray + 0x104);
                            bVar84 = (bool)((byte)(uVar86 >> 2) & 1);
                            auVar144._8_4_ =
                                 (uint)bVar84 * auVar102._8_4_ |
                                 (uint)!bVar84 * *(int *)(local_910.ray + 0x108);
                            bVar84 = (bool)((byte)(uVar86 >> 3) & 1);
                            auVar144._12_4_ =
                                 (uint)bVar84 * auVar102._12_4_ |
                                 (uint)!bVar84 * *(int *)(local_910.ray + 0x10c);
                            bVar84 = (bool)((byte)(uVar86 >> 4) & 1);
                            auVar144._16_4_ =
                                 (uint)bVar84 * auVar102._16_4_ |
                                 (uint)!bVar84 * *(int *)(local_910.ray + 0x110);
                            bVar84 = (bool)((byte)(uVar86 >> 5) & 1);
                            auVar144._20_4_ =
                                 (uint)bVar84 * auVar102._20_4_ |
                                 (uint)!bVar84 * *(int *)(local_910.ray + 0x114);
                            bVar84 = (bool)((byte)(uVar86 >> 6) & 1);
                            auVar144._24_4_ =
                                 (uint)bVar84 * auVar102._24_4_ |
                                 (uint)!bVar84 * *(int *)(local_910.ray + 0x118);
                            bVar84 = SUB81(uVar86 >> 7,0);
                            auVar144._28_4_ =
                                 (uint)bVar84 * auVar102._28_4_ |
                                 (uint)!bVar84 * *(int *)(local_910.ray + 0x11c);
                            *(undefined1 (*) [32])(local_910.ray + 0x100) = auVar144;
                            bVar77 = auVar65 != (undefined1  [32])0x0;
                          }
                          if ((bool)bVar77 == false) {
                            *(float *)(ray + k * 4 + 0x100) = fVar254;
                          }
                        }
                        bVar84 = false;
                        goto LAB_01d475bc;
                      }
                    }
                    bVar84 = false;
                    bVar77 = 0;
                  }
                }
LAB_01d475bc:
                if (!bVar84) goto LAB_01d478e5;
                lVar83 = lVar83 + -1;
              } while (lVar83 != 0);
              bVar77 = 0;
LAB_01d478e5:
              bVar75 = bVar75 | bVar77 & 1;
              auVar69._4_4_ = fStack_6fc;
              auVar69._0_4_ = local_700;
              auVar69._8_4_ = fStack_6f8;
              auVar69._12_4_ = fStack_6f4;
              auVar69._16_4_ = fStack_6f0;
              auVar69._20_4_ = fStack_6ec;
              auVar69._24_4_ = fStack_6e8;
              auVar69._28_4_ = fStack_6e4;
              uVar155 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar28._4_4_ = uVar155;
              auVar28._0_4_ = uVar155;
              auVar28._8_4_ = uVar155;
              auVar28._12_4_ = uVar155;
              auVar28._16_4_ = uVar155;
              auVar28._20_4_ = uVar155;
              auVar28._24_4_ = uVar155;
              auVar28._28_4_ = uVar155;
              uVar14 = vcmpps_avx512vl(auVar69,auVar28,2);
              bVar78 = bVar79 & bVar78 & (byte)uVar14;
            } while (bVar78 != 0);
          }
          uVar16 = vpcmpd_avx512vl(local_640,_local_720,1);
          uVar15 = vpcmpd_avx512vl(local_640,local_440,1);
          auVar194._0_4_ = (float)local_740._0_4_ + (float)local_1c0._0_4_;
          auVar194._4_4_ = (float)local_740._4_4_ + (float)local_1c0._4_4_;
          auVar194._8_4_ = fStack_738 + fStack_1b8;
          auVar194._12_4_ = fStack_734 + fStack_1b4;
          auVar194._16_4_ = fStack_730 + fStack_1b0;
          auVar194._20_4_ = fStack_72c + fStack_1ac;
          auVar194._24_4_ = fStack_728 + fStack_1a8;
          auVar194._28_4_ = fStack_724 + fStack_1a4;
          uVar155 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar215._4_4_ = uVar155;
          auVar215._0_4_ = uVar155;
          auVar215._8_4_ = uVar155;
          auVar215._12_4_ = uVar155;
          auVar215._16_4_ = uVar155;
          auVar215._20_4_ = uVar155;
          auVar215._24_4_ = uVar155;
          auVar215._28_4_ = uVar155;
          uVar14 = vcmpps_avx512vl(auVar194,auVar215,2);
          bVar73 = bVar73 & (byte)uVar15 & (byte)uVar14;
          auVar229._0_4_ = (float)local_740._0_4_ + (float)local_480._0_4_;
          auVar229._4_4_ = (float)local_740._4_4_ + (float)local_480._4_4_;
          auVar229._8_4_ = fStack_738 + fStack_478;
          auVar229._12_4_ = fStack_734 + fStack_474;
          auVar229._16_4_ = fStack_730 + fStack_470;
          auVar229._20_4_ = fStack_72c + fStack_46c;
          auVar229._24_4_ = fStack_728 + fStack_468;
          auVar229._28_4_ = fStack_724 + fStack_464;
          uVar14 = vcmpps_avx512vl(auVar229,auVar215,2);
          bVar71 = bVar71 & (byte)uVar16 & (byte)uVar14 | bVar73;
          if (bVar71 == 0) {
            auVar230 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,&DAT_3f8000003f800000)))))));
            auVar216 = ZEXT1664(auVar199);
          }
          else {
            local_180[uVar74 * 0x60] = bVar71;
            auVar145._0_4_ =
                 (uint)(bVar73 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar73 & 1) * local_480._0_4_;
            bVar84 = (bool)(bVar73 >> 1 & 1);
            auVar145._4_4_ = (uint)bVar84 * local_1c0._4_4_ | (uint)!bVar84 * local_480._4_4_;
            bVar84 = (bool)(bVar73 >> 2 & 1);
            auVar145._8_4_ = (uint)bVar84 * (int)fStack_1b8 | (uint)!bVar84 * (int)fStack_478;
            bVar84 = (bool)(bVar73 >> 3 & 1);
            auVar145._12_4_ = (uint)bVar84 * (int)fStack_1b4 | (uint)!bVar84 * (int)fStack_474;
            bVar84 = (bool)(bVar73 >> 4 & 1);
            auVar145._16_4_ = (uint)bVar84 * (int)fStack_1b0 | (uint)!bVar84 * (int)fStack_470;
            bVar84 = (bool)(bVar73 >> 5 & 1);
            auVar145._20_4_ = (uint)bVar84 * (int)fStack_1ac | (uint)!bVar84 * (int)fStack_46c;
            auVar145._24_4_ =
                 (uint)(bVar73 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar73 >> 6) * (int)fStack_468;
            auVar145._28_4_ = fStack_464;
            *(undefined1 (*) [32])(auStack_160 + uVar74 * 0x60) = auVar145;
            auVar216 = ZEXT1664(auVar199);
            uVar14 = vmovlps_avx(auVar199);
            *(undefined8 *)(local_140 + uVar74 * 0x18) = uVar14;
            local_138[uVar74 * 0x18] = iVar82 + 1;
            auVar230 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,&DAT_3f8000003f800000)))))));
            uVar74 = (ulong)((int)uVar74 + 1);
          }
        }
      }
    }
    do {
      if ((int)uVar74 == 0) {
        if (bVar75 != 0) {
          return bVar85;
        }
        uVar155 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar30._4_4_ = uVar155;
        auVar30._0_4_ = uVar155;
        auVar30._8_4_ = uVar155;
        auVar30._12_4_ = uVar155;
        auVar30._16_4_ = uVar155;
        auVar30._20_4_ = uVar155;
        auVar30._24_4_ = uVar155;
        auVar30._28_4_ = uVar155;
        uVar14 = vcmpps_avx512vl(local_420,auVar30,2);
        uVar80 = (uint)uVar81 & (uint)uVar14;
        uVar81 = (ulong)uVar80;
        bVar85 = uVar80 != 0;
        if (!bVar85) {
          return bVar85;
        }
        goto LAB_01d45571;
      }
      uVar76 = (ulong)((int)uVar74 - 1);
      lVar83 = uVar76 * 0x60;
      auVar102 = *(undefined1 (*) [32])(auStack_160 + lVar83);
      auVar195._0_4_ = auVar102._0_4_ + (float)local_740._0_4_;
      auVar195._4_4_ = auVar102._4_4_ + (float)local_740._4_4_;
      auVar195._8_4_ = auVar102._8_4_ + fStack_738;
      auVar195._12_4_ = auVar102._12_4_ + fStack_734;
      auVar195._16_4_ = auVar102._16_4_ + fStack_730;
      auVar195._20_4_ = auVar102._20_4_ + fStack_72c;
      auVar195._24_4_ = auVar102._24_4_ + fStack_728;
      auVar195._28_4_ = auVar102._28_4_ + fStack_724;
      uVar155 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar29._4_4_ = uVar155;
      auVar29._0_4_ = uVar155;
      auVar29._8_4_ = uVar155;
      auVar29._12_4_ = uVar155;
      auVar29._16_4_ = uVar155;
      auVar29._20_4_ = uVar155;
      auVar29._24_4_ = uVar155;
      auVar29._28_4_ = uVar155;
      uVar14 = vcmpps_avx512vl(auVar195,auVar29,2);
      uVar87 = (uint)uVar14 & (uint)local_180[lVar83];
      bVar71 = (byte)uVar87;
      uVar86 = uVar76;
      if (uVar87 != 0) {
        auVar196._8_4_ = 0x7f800000;
        auVar196._0_8_ = 0x7f8000007f800000;
        auVar196._12_4_ = 0x7f800000;
        auVar196._16_4_ = 0x7f800000;
        auVar196._20_4_ = 0x7f800000;
        auVar196._24_4_ = 0x7f800000;
        auVar196._28_4_ = 0x7f800000;
        auVar101 = vblendmps_avx512vl(auVar196,auVar102);
        auVar146._0_4_ =
             (uint)(bVar71 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar71 & 1) * (int)auVar102._0_4_;
        bVar84 = (bool)((byte)(uVar87 >> 1) & 1);
        auVar146._4_4_ = (uint)bVar84 * auVar101._4_4_ | (uint)!bVar84 * (int)auVar102._4_4_;
        bVar84 = (bool)((byte)(uVar87 >> 2) & 1);
        auVar146._8_4_ = (uint)bVar84 * auVar101._8_4_ | (uint)!bVar84 * (int)auVar102._8_4_;
        bVar84 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar146._12_4_ = (uint)bVar84 * auVar101._12_4_ | (uint)!bVar84 * (int)auVar102._12_4_;
        bVar84 = (bool)((byte)(uVar87 >> 4) & 1);
        auVar146._16_4_ = (uint)bVar84 * auVar101._16_4_ | (uint)!bVar84 * (int)auVar102._16_4_;
        bVar84 = (bool)((byte)(uVar87 >> 5) & 1);
        auVar146._20_4_ = (uint)bVar84 * auVar101._20_4_ | (uint)!bVar84 * (int)auVar102._20_4_;
        bVar84 = (bool)((byte)(uVar87 >> 6) & 1);
        auVar146._24_4_ = (uint)bVar84 * auVar101._24_4_ | (uint)!bVar84 * (int)auVar102._24_4_;
        auVar146._28_4_ =
             (uVar87 >> 7) * auVar101._28_4_ | (uint)!SUB41(uVar87 >> 7,0) * (int)auVar102._28_4_;
        auVar102 = vshufps_avx(auVar146,auVar146,0xb1);
        auVar102 = vminps_avx(auVar146,auVar102);
        auVar101 = vshufpd_avx(auVar102,auVar102,5);
        auVar102 = vminps_avx(auVar102,auVar101);
        auVar101 = vpermpd_avx2(auVar102,0x4e);
        auVar102 = vminps_avx(auVar102,auVar101);
        uVar14 = vcmpps_avx512vl(auVar146,auVar102,0);
        bVar78 = (byte)uVar14 & bVar71;
        if (bVar78 != 0) {
          uVar87 = (uint)bVar78;
        }
        fVar250 = local_140[uVar76 * 0x18 + 1];
        uVar147 = 0;
        for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
          uVar147 = uVar147 + 1;
        }
        iVar82 = local_138[uVar76 * 0x18];
        bVar78 = ~('\x01' << ((byte)uVar147 & 0x1f)) & bVar71;
        local_180[lVar83] = bVar78;
        if (bVar78 != 0) {
          uVar86 = uVar74;
        }
        fVar252 = local_140[uVar76 * 0x18];
        auVar197._4_4_ = fVar252;
        auVar197._0_4_ = fVar252;
        auVar197._8_4_ = fVar252;
        auVar197._12_4_ = fVar252;
        auVar197._16_4_ = fVar252;
        auVar197._20_4_ = fVar252;
        auVar197._24_4_ = fVar252;
        auVar197._28_4_ = fVar252;
        fVar250 = fVar250 - fVar252;
        auVar173._4_4_ = fVar250;
        auVar173._0_4_ = fVar250;
        auVar173._8_4_ = fVar250;
        auVar173._12_4_ = fVar250;
        auVar173._16_4_ = fVar250;
        auVar173._20_4_ = fVar250;
        auVar173._24_4_ = fVar250;
        auVar173._28_4_ = fVar250;
        auVar90 = vfmadd132ps_fma(auVar173,auVar197,_DAT_02020f20);
        auVar102 = ZEXT1632(auVar90);
        local_5a0[0] = (RTCHitN)auVar102[0];
        local_5a0[1] = (RTCHitN)auVar102[1];
        local_5a0[2] = (RTCHitN)auVar102[2];
        local_5a0[3] = (RTCHitN)auVar102[3];
        local_5a0[4] = (RTCHitN)auVar102[4];
        local_5a0[5] = (RTCHitN)auVar102[5];
        local_5a0[6] = (RTCHitN)auVar102[6];
        local_5a0[7] = (RTCHitN)auVar102[7];
        local_5a0[8] = (RTCHitN)auVar102[8];
        local_5a0[9] = (RTCHitN)auVar102[9];
        local_5a0[10] = (RTCHitN)auVar102[10];
        local_5a0[0xb] = (RTCHitN)auVar102[0xb];
        local_5a0[0xc] = (RTCHitN)auVar102[0xc];
        local_5a0[0xd] = (RTCHitN)auVar102[0xd];
        local_5a0[0xe] = (RTCHitN)auVar102[0xe];
        local_5a0[0xf] = (RTCHitN)auVar102[0xf];
        local_5a0[0x10] = (RTCHitN)auVar102[0x10];
        local_5a0[0x11] = (RTCHitN)auVar102[0x11];
        local_5a0[0x12] = (RTCHitN)auVar102[0x12];
        local_5a0[0x13] = (RTCHitN)auVar102[0x13];
        local_5a0[0x14] = (RTCHitN)auVar102[0x14];
        local_5a0[0x15] = (RTCHitN)auVar102[0x15];
        local_5a0[0x16] = (RTCHitN)auVar102[0x16];
        local_5a0[0x17] = (RTCHitN)auVar102[0x17];
        local_5a0[0x18] = (RTCHitN)auVar102[0x18];
        local_5a0[0x19] = (RTCHitN)auVar102[0x19];
        local_5a0[0x1a] = (RTCHitN)auVar102[0x1a];
        local_5a0[0x1b] = (RTCHitN)auVar102[0x1b];
        local_5a0[0x1c] = (RTCHitN)auVar102[0x1c];
        local_5a0[0x1d] = (RTCHitN)auVar102[0x1d];
        local_5a0[0x1e] = (RTCHitN)auVar102[0x1e];
        local_5a0[0x1f] = (RTCHitN)auVar102[0x1f];
        auVar216 = ZEXT864(*(ulong *)(local_5a0 + (ulong)uVar147 * 4));
      }
      uVar74 = uVar86;
    } while (bVar71 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }